

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx::CurveNiIntersectorK<4,8>::
     intersect_n<embree::avx::OrientedCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  Primitive PVar9;
  uint uVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  void *pvVar13;
  __int_type_conflict _Var14;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  uint uVar59;
  uint uVar60;
  long lVar61;
  uint uVar62;
  uint uVar64;
  ulong uVar65;
  ulong uVar66;
  float fVar67;
  float fVar95;
  float fVar96;
  vint4 bi_2;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar97;
  undefined1 auVar70 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar71 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  vint4 bi_1;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar102 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  vint4 ai;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  float t1;
  float fVar147;
  float fVar157;
  float fVar158;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar159;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  vint4 bi;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  float fVar177;
  float fVar193;
  float fVar194;
  vint4 ai_2;
  undefined1 auVar178 [16];
  float fVar195;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  float fVar196;
  float fVar210;
  float fVar211;
  vint4 ai_1;
  undefined1 auVar197 [16];
  float fVar212;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  vfloat4 b0;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  float fVar233;
  float fVar245;
  float fVar246;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  float fVar248;
  float fVar249;
  float fVar250;
  undefined1 auVar243 [32];
  float fVar247;
  undefined1 auVar244 [32];
  float pp;
  float fVar251;
  float fVar257;
  float fVar258;
  float fVar259;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [32];
  float fVar260;
  float fVar269;
  float fVar270;
  vfloat4 a0_1;
  float fVar271;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [32];
  float fVar272;
  float fVar277;
  float fVar278;
  undefined1 auVar273 [16];
  float fVar279;
  undefined1 auVar274 [16];
  float fVar280;
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar289;
  float fVar290;
  undefined1 auVar286 [16];
  float fVar291;
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  float fVar292;
  float fVar293;
  float fVar301;
  float fVar302;
  float fVar303;
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar300 [64];
  float fVar307;
  vfloat4 a0;
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [64];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined1 local_6d0 [8];
  float fStack_6c8;
  float fStack_6c4;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float local_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  RTCFilterFunctionNArguments local_550;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  undefined1 auStack_510 [16];
  undefined1 local_4f0 [8];
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  undefined1 local_4d0 [8];
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  undefined1 local_4b0 [8];
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  uint auStack_490 [4];
  undefined1 local_480 [16];
  undefined1 local_470 [8];
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 local_450 [8];
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  undefined1 local_430 [8];
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  float afStack_340 [8];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 auStack_170 [16];
  undefined1 local_160 [16];
  undefined1 auStack_150 [16];
  undefined1 local_140 [16];
  undefined1 auStack_130 [16];
  undefined1 local_120 [16];
  undefined1 auStack_110 [16];
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar63;
  undefined1 auVar209 [32];
  undefined1 auVar299 [32];
  
  PVar9 = prim[1];
  uVar66 = (ulong)(byte)PVar9;
  auVar75 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar263 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar263 = vinsertps_avx(auVar263,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar75 = vsubps_avx(auVar75,*(undefined1 (*) [16])(prim + uVar66 * 0x19 + 6));
  fVar177 = *(float *)(prim + uVar66 * 0x19 + 0x12);
  auVar98._0_4_ = fVar177 * auVar75._0_4_;
  auVar98._4_4_ = fVar177 * auVar75._4_4_;
  auVar98._8_4_ = fVar177 * auVar75._8_4_;
  auVar98._12_4_ = fVar177 * auVar75._12_4_;
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 4 + 6)));
  auVar213._0_4_ = fVar177 * auVar263._0_4_;
  auVar213._4_4_ = fVar177 * auVar263._4_4_;
  auVar213._8_4_ = fVar177 * auVar263._8_4_;
  auVar213._12_4_ = fVar177 * auVar263._12_4_;
  auVar263 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 5 + 6)));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar143 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 6 + 6)));
  auVar263 = vcvtdq2ps_avx(auVar263);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0xb + 6)));
  auVar143 = vcvtdq2ps_avx(auVar143);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0xc + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0xd + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x12 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar104 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x13 + 6)));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar129 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x14 + 6)));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar68 = vshufps_avx(auVar213,auVar213,0);
  auVar99 = vshufps_avx(auVar213,auVar213,0x55);
  auVar121 = vshufps_avx(auVar213,auVar213,0xaa);
  fVar177 = auVar121._0_4_;
  fVar147 = auVar121._4_4_;
  fVar193 = auVar121._8_4_;
  fVar157 = auVar121._12_4_;
  fVar196 = auVar99._0_4_;
  fVar210 = auVar99._4_4_;
  fVar211 = auVar99._8_4_;
  fVar212 = auVar99._12_4_;
  fVar194 = auVar68._0_4_;
  fVar158 = auVar68._4_4_;
  fVar195 = auVar68._8_4_;
  fVar159 = auVar68._12_4_;
  auVar273._0_4_ = fVar194 * auVar75._0_4_ + fVar196 * auVar263._0_4_ + fVar177 * auVar143._0_4_;
  auVar273._4_4_ = fVar158 * auVar75._4_4_ + fVar210 * auVar263._4_4_ + fVar147 * auVar143._4_4_;
  auVar273._8_4_ = fVar195 * auVar75._8_4_ + fVar211 * auVar263._8_4_ + fVar193 * auVar143._8_4_;
  auVar273._12_4_ = fVar159 * auVar75._12_4_ + fVar212 * auVar263._12_4_ + fVar157 * auVar143._12_4_
  ;
  auVar286._0_4_ = fVar194 * auVar16._0_4_ + fVar196 * auVar17._0_4_ + auVar18._0_4_ * fVar177;
  auVar286._4_4_ = fVar158 * auVar16._4_4_ + fVar210 * auVar17._4_4_ + auVar18._4_4_ * fVar147;
  auVar286._8_4_ = fVar195 * auVar16._8_4_ + fVar211 * auVar17._8_4_ + auVar18._8_4_ * fVar193;
  auVar286._12_4_ = fVar159 * auVar16._12_4_ + fVar212 * auVar17._12_4_ + auVar18._12_4_ * fVar157;
  auVar214._0_4_ = fVar194 * auVar69._0_4_ + fVar196 * auVar104._0_4_ + auVar129._0_4_ * fVar177;
  auVar214._4_4_ = fVar158 * auVar69._4_4_ + fVar210 * auVar104._4_4_ + auVar129._4_4_ * fVar147;
  auVar214._8_4_ = fVar195 * auVar69._8_4_ + fVar211 * auVar104._8_4_ + auVar129._8_4_ * fVar193;
  auVar214._12_4_ = fVar159 * auVar69._12_4_ + fVar212 * auVar104._12_4_ + auVar129._12_4_ * fVar157
  ;
  auVar68 = vshufps_avx(auVar98,auVar98,0);
  auVar99 = vshufps_avx(auVar98,auVar98,0x55);
  auVar121 = vshufps_avx(auVar98,auVar98,0xaa);
  fVar177 = auVar121._0_4_;
  fVar147 = auVar121._4_4_;
  fVar193 = auVar121._8_4_;
  fVar157 = auVar121._12_4_;
  fVar196 = auVar99._0_4_;
  fVar210 = auVar99._4_4_;
  fVar211 = auVar99._8_4_;
  fVar212 = auVar99._12_4_;
  fVar194 = auVar68._0_4_;
  fVar158 = auVar68._4_4_;
  fVar195 = auVar68._8_4_;
  fVar159 = auVar68._12_4_;
  auVar160._0_4_ = fVar194 * auVar75._0_4_ + fVar196 * auVar263._0_4_ + fVar177 * auVar143._0_4_;
  auVar160._4_4_ = fVar158 * auVar75._4_4_ + fVar210 * auVar263._4_4_ + fVar147 * auVar143._4_4_;
  auVar160._8_4_ = fVar195 * auVar75._8_4_ + fVar211 * auVar263._8_4_ + fVar193 * auVar143._8_4_;
  auVar160._12_4_ = fVar159 * auVar75._12_4_ + fVar212 * auVar263._12_4_ + fVar157 * auVar143._12_4_
  ;
  auVar99._0_4_ = fVar194 * auVar16._0_4_ + auVar18._0_4_ * fVar177 + fVar196 * auVar17._0_4_;
  auVar99._4_4_ = fVar158 * auVar16._4_4_ + auVar18._4_4_ * fVar147 + fVar210 * auVar17._4_4_;
  auVar99._8_4_ = fVar195 * auVar16._8_4_ + auVar18._8_4_ * fVar193 + fVar211 * auVar17._8_4_;
  auVar99._12_4_ = fVar159 * auVar16._12_4_ + auVar18._12_4_ * fVar157 + fVar212 * auVar17._12_4_;
  auVar68._0_4_ = fVar196 * auVar104._0_4_ + auVar129._0_4_ * fVar177 + fVar194 * auVar69._0_4_;
  auVar68._4_4_ = fVar210 * auVar104._4_4_ + auVar129._4_4_ * fVar147 + fVar158 * auVar69._4_4_;
  auVar68._8_4_ = fVar211 * auVar104._8_4_ + auVar129._8_4_ * fVar193 + fVar195 * auVar69._8_4_;
  auVar68._12_4_ = fVar212 * auVar104._12_4_ + auVar129._12_4_ * fVar157 + fVar159 * auVar69._12_4_;
  auVar197._8_4_ = 0x7fffffff;
  auVar197._0_8_ = 0x7fffffff7fffffff;
  auVar197._12_4_ = 0x7fffffff;
  auVar75 = vandps_avx(auVar273,auVar197);
  auVar148._8_4_ = 0x219392ef;
  auVar148._0_8_ = 0x219392ef219392ef;
  auVar148._12_4_ = 0x219392ef;
  auVar75 = vcmpps_avx(auVar75,auVar148,1);
  auVar263 = vblendvps_avx(auVar273,auVar148,auVar75);
  auVar75 = vandps_avx(auVar286,auVar197);
  auVar75 = vcmpps_avx(auVar75,auVar148,1);
  auVar143 = vblendvps_avx(auVar286,auVar148,auVar75);
  auVar75 = vandps_avx(auVar214,auVar197);
  auVar75 = vcmpps_avx(auVar75,auVar148,1);
  auVar75 = vblendvps_avx(auVar214,auVar148,auVar75);
  auVar16 = vrcpps_avx(auVar263);
  fVar196 = auVar16._0_4_;
  auVar121._0_4_ = fVar196 * auVar263._0_4_;
  fVar210 = auVar16._4_4_;
  auVar121._4_4_ = fVar210 * auVar263._4_4_;
  fVar211 = auVar16._8_4_;
  auVar121._8_4_ = fVar211 * auVar263._8_4_;
  fVar212 = auVar16._12_4_;
  auVar121._12_4_ = fVar212 * auVar263._12_4_;
  auVar215._8_4_ = 0x3f800000;
  auVar215._0_8_ = 0x3f8000003f800000;
  auVar215._12_4_ = 0x3f800000;
  auVar263 = vsubps_avx(auVar215,auVar121);
  fVar196 = fVar196 + fVar196 * auVar263._0_4_;
  fVar210 = fVar210 + fVar210 * auVar263._4_4_;
  fVar211 = fVar211 + fVar211 * auVar263._8_4_;
  fVar212 = fVar212 + fVar212 * auVar263._12_4_;
  auVar263 = vrcpps_avx(auVar143);
  fVar177 = auVar263._0_4_;
  auVar178._0_4_ = fVar177 * auVar143._0_4_;
  fVar193 = auVar263._4_4_;
  auVar178._4_4_ = fVar193 * auVar143._4_4_;
  fVar194 = auVar263._8_4_;
  auVar178._8_4_ = fVar194 * auVar143._8_4_;
  fVar195 = auVar263._12_4_;
  auVar178._12_4_ = fVar195 * auVar143._12_4_;
  auVar263 = vsubps_avx(auVar215,auVar178);
  fVar177 = fVar177 + fVar177 * auVar263._0_4_;
  fVar193 = fVar193 + fVar193 * auVar263._4_4_;
  fVar194 = fVar194 + fVar194 * auVar263._8_4_;
  fVar195 = fVar195 + fVar195 * auVar263._12_4_;
  auVar263 = vrcpps_avx(auVar75);
  fVar147 = auVar263._0_4_;
  auVar149._0_4_ = fVar147 * auVar75._0_4_;
  fVar157 = auVar263._4_4_;
  auVar149._4_4_ = fVar157 * auVar75._4_4_;
  fVar158 = auVar263._8_4_;
  auVar149._8_4_ = fVar158 * auVar75._8_4_;
  fVar159 = auVar263._12_4_;
  auVar149._12_4_ = fVar159 * auVar75._12_4_;
  auVar75 = vsubps_avx(auVar215,auVar149);
  fVar147 = fVar147 + fVar147 * auVar75._0_4_;
  fVar157 = fVar157 + fVar157 * auVar75._4_4_;
  fVar158 = fVar158 + fVar158 * auVar75._8_4_;
  fVar159 = fVar159 + fVar159 * auVar75._12_4_;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar66 * 7 + 6);
  auVar75 = vpmovsxwd_avx(auVar75);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar143 = vsubps_avx(auVar75,auVar160);
  auVar263._8_8_ = 0;
  auVar263._0_8_ = *(ulong *)(prim + uVar66 * 9 + 6);
  auVar75 = vpmovsxwd_avx(auVar263);
  auVar122._0_4_ = fVar196 * auVar143._0_4_;
  auVar122._4_4_ = fVar210 * auVar143._4_4_;
  auVar122._8_4_ = fVar211 * auVar143._8_4_;
  auVar122._12_4_ = fVar212 * auVar143._12_4_;
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar160);
  auVar161._0_4_ = fVar196 * auVar75._0_4_;
  auVar161._4_4_ = fVar210 * auVar75._4_4_;
  auVar161._8_4_ = fVar211 * auVar75._8_4_;
  auVar161._12_4_ = fVar212 * auVar75._12_4_;
  auVar143._8_8_ = 0;
  auVar143._0_8_ = *(ulong *)(prim + uVar66 * 0xe + 6);
  auVar75 = vpmovsxwd_avx(auVar143);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar263 = vsubps_avx(auVar75,auVar99);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + 6);
  auVar75 = vpmovsxwd_avx(auVar16);
  auVar198._0_4_ = auVar263._0_4_ * fVar177;
  auVar198._4_4_ = auVar263._4_4_ * fVar193;
  auVar198._8_4_ = auVar263._8_4_ * fVar194;
  auVar198._12_4_ = auVar263._12_4_ * fVar195;
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar99);
  auVar129._0_4_ = fVar177 * auVar75._0_4_;
  auVar129._4_4_ = fVar193 * auVar75._4_4_;
  auVar129._8_4_ = fVar194 * auVar75._8_4_;
  auVar129._12_4_ = fVar195 * auVar75._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar66 * 0x15 + 6);
  auVar75 = vpmovsxwd_avx(auVar17);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar68);
  auVar179._0_4_ = auVar75._0_4_ * fVar147;
  auVar179._4_4_ = auVar75._4_4_ * fVar157;
  auVar179._8_4_ = auVar75._8_4_ * fVar158;
  auVar179._12_4_ = auVar75._12_4_ * fVar159;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar66 * 0x17 + 6);
  auVar75 = vpmovsxwd_avx(auVar18);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar68);
  auVar69._0_4_ = auVar75._0_4_ * fVar147;
  auVar69._4_4_ = auVar75._4_4_ * fVar157;
  auVar69._8_4_ = auVar75._8_4_ * fVar158;
  auVar69._12_4_ = auVar75._12_4_ * fVar159;
  auVar75 = vpminsd_avx(auVar122,auVar161);
  auVar263 = vpminsd_avx(auVar198,auVar129);
  auVar75 = vmaxps_avx(auVar75,auVar263);
  auVar263 = vpminsd_avx(auVar179,auVar69);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar234._4_4_ = uVar6;
  auVar234._0_4_ = uVar6;
  auVar234._8_4_ = uVar6;
  auVar234._12_4_ = uVar6;
  auVar263 = vmaxps_avx(auVar263,auVar234);
  auVar75 = vmaxps_avx(auVar75,auVar263);
  local_480._0_4_ = auVar75._0_4_ * 0.99999964;
  local_480._4_4_ = auVar75._4_4_ * 0.99999964;
  local_480._8_4_ = auVar75._8_4_ * 0.99999964;
  local_480._12_4_ = auVar75._12_4_ * 0.99999964;
  auVar75 = vpmaxsd_avx(auVar122,auVar161);
  auVar263 = vpmaxsd_avx(auVar198,auVar129);
  auVar75 = vminps_avx(auVar75,auVar263);
  auVar263 = vpmaxsd_avx(auVar179,auVar69);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar123._4_4_ = uVar6;
  auVar123._0_4_ = uVar6;
  auVar123._8_4_ = uVar6;
  auVar123._12_4_ = uVar6;
  auVar263 = vminps_avx(auVar263,auVar123);
  auVar75 = vminps_avx(auVar75,auVar263);
  auVar104._0_4_ = auVar75._0_4_ * 1.0000004;
  auVar104._4_4_ = auVar75._4_4_ * 1.0000004;
  auVar104._8_4_ = auVar75._8_4_ * 1.0000004;
  auVar104._12_4_ = auVar75._12_4_ * 1.0000004;
  auVar75 = vpshufd_avx(ZEXT116((byte)PVar9),0);
  auVar263 = vpcmpgtd_avx(auVar75,_DAT_01f4ad30);
  auVar75 = vcmpps_avx(local_480,auVar104,2);
  auVar75 = vandps_avx(auVar75,auVar263);
  uVar59 = vmovmskps_avx(auVar75);
  auVar87._16_16_ = mm_lookupmask_ps._240_16_;
  auVar87._0_16_ = mm_lookupmask_ps._240_16_;
  local_2e0 = vblendps_avx(auVar87,ZEXT832(0) << 0x20,0x80);
  uVar64 = 1 << ((byte)k & 0x1f);
LAB_007a3df2:
  uVar66 = (ulong)uVar59;
  if (uVar66 == 0) {
    return;
  }
  lVar61 = 0;
  if (uVar66 != 0) {
    for (; (uVar59 >> lVar61 & 1) == 0; lVar61 = lVar61 + 1) {
    }
  }
  uVar59 = *(uint *)(prim + 2);
  uVar10 = *(uint *)(prim + lVar61 * 4 + 6);
  pGVar11 = (context->scene->geometries).items[uVar59].ptr;
  uVar65 = (ulong)*(uint *)(*(long *)&pGVar11->field_0x58 +
                           pGVar11[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar10);
  p_Var12 = pGVar11[1].intersectionFilterN;
  pvVar13 = pGVar11[2].userPtr;
  _Var14 = pGVar11[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(_Var14 + uVar65 * (long)pvVar13);
  fVar177 = *pfVar1;
  fVar147 = pfVar1[1];
  fVar193 = pfVar1[2];
  fVar157 = pfVar1[3];
  pfVar1 = (float *)(_Var14 + (uVar65 + 1) * (long)pvVar13);
  pfVar2 = (float *)(_Var14 + (uVar65 + 2) * (long)pvVar13);
  pfVar3 = (float *)(_Var14 + (long)pvVar13 * (uVar65 + 3));
  fVar194 = *pfVar3;
  fVar158 = pfVar3[1];
  fVar195 = pfVar3[2];
  fVar159 = pfVar3[3];
  uVar66 = uVar66 - 1 & uVar66;
  lVar61 = *(long *)&pGVar11[1].time_range.upper;
  pfVar3 = (float *)(lVar61 + (long)p_Var12 * uVar65);
  fVar196 = *pfVar3;
  fVar210 = pfVar3[1];
  fVar211 = pfVar3[2];
  fVar212 = pfVar3[3];
  pfVar3 = (float *)(lVar61 + (long)p_Var12 * (uVar65 + 1));
  pfVar4 = (float *)(lVar61 + (long)p_Var12 * (uVar65 + 2));
  lVar15 = 0;
  if (uVar66 != 0) {
    for (; (uVar66 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
    }
  }
  pfVar5 = (float *)(lVar61 + (long)p_Var12 * (uVar65 + 3));
  fVar67 = *pfVar5;
  fVar95 = pfVar5[1];
  fVar96 = pfVar5[2];
  fVar97 = pfVar5[3];
  if (((uVar66 != 0) && (uVar65 = uVar66 - 1 & uVar66, uVar65 != 0)) && (lVar61 = 0, uVar65 != 0)) {
    for (; (uVar65 >> lVar61 & 1) == 0; lVar61 = lVar61 + 1) {
    }
  }
  auVar75 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar143 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar251 = *pfVar4 * 0.0;
  fVar257 = pfVar4[1] * 0.0;
  fVar258 = pfVar4[2] * 0.0;
  fVar259 = pfVar4[3] * 0.0;
  fVar260 = fVar251 + fVar67 * 0.0;
  fVar269 = fVar257 + fVar95 * 0.0;
  fVar270 = fVar258 + fVar96 * 0.0;
  fVar271 = fVar259 + fVar97 * 0.0;
  fVar272 = *pfVar3 * 0.0;
  fVar277 = pfVar3[1] * 0.0;
  fVar278 = pfVar3[2] * 0.0;
  fVar279 = pfVar3[3] * 0.0;
  local_700._0_4_ = fVar196 + fVar272 + fVar260;
  local_700._4_4_ = fVar210 + fVar277 + fVar269;
  fStack_6f8 = fVar211 + fVar278 + fVar270;
  fStack_6f4 = fVar212 + fVar279 + fVar271;
  auVar124._0_4_ = fVar260 + *pfVar3 * 3.0;
  auVar124._4_4_ = fVar269 + pfVar3[1] * 3.0;
  auVar124._8_4_ = fVar270 + pfVar3[2] * 3.0;
  auVar124._12_4_ = fVar271 + pfVar3[3] * 3.0;
  auVar261._0_4_ = fVar196 * 3.0;
  auVar261._4_4_ = fVar210 * 3.0;
  auVar261._8_4_ = fVar211 * 3.0;
  auVar261._12_4_ = fVar212 * 3.0;
  auVar129 = vsubps_avx(auVar124,auVar261);
  fVar285 = *pfVar2 * 0.0;
  fVar289 = pfVar2[1] * 0.0;
  fVar290 = pfVar2[2] * 0.0;
  fVar291 = pfVar2[3] * 0.0;
  fVar260 = fVar285 + fVar194 * 0.0;
  fVar269 = fVar289 + fVar158 * 0.0;
  fVar270 = fVar290 + fVar195 * 0.0;
  fVar271 = fVar291 + fVar159 * 0.0;
  fVar293 = *pfVar1 * 0.0;
  fVar301 = pfVar1[1] * 0.0;
  fVar302 = pfVar1[2] * 0.0;
  fVar303 = pfVar1[3] * 0.0;
  auVar304._0_4_ = fVar293 + fVar260 + fVar177;
  auVar304._4_4_ = fVar301 + fVar269 + fVar147;
  auVar304._8_4_ = fVar302 + fVar270 + fVar193;
  auVar304._12_4_ = fVar303 + fVar271 + fVar157;
  auVar150._0_4_ = fVar260 + *pfVar1 * 3.0;
  auVar150._4_4_ = fVar269 + pfVar1[1] * 3.0;
  auVar150._8_4_ = fVar270 + pfVar1[2] * 3.0;
  auVar150._12_4_ = fVar271 + pfVar1[3] * 3.0;
  auVar262._0_4_ = fVar177 * 3.0;
  auVar262._4_4_ = fVar147 * 3.0;
  auVar262._8_4_ = fVar193 * 3.0;
  auVar262._12_4_ = fVar157 * 3.0;
  auVar17 = vsubps_avx(auVar150,auVar262);
  auVar225._0_4_ = fVar196 * 0.0;
  auVar225._4_4_ = fVar210 * 0.0;
  auVar225._8_4_ = fVar211 * 0.0;
  auVar225._12_4_ = fVar212 * 0.0;
  auVar151._0_4_ = auVar225._0_4_ + fVar272 + fVar251 + fVar67;
  auVar151._4_4_ = auVar225._4_4_ + fVar277 + fVar257 + fVar95;
  auVar151._8_4_ = auVar225._8_4_ + fVar278 + fVar258 + fVar96;
  auVar151._12_4_ = auVar225._12_4_ + fVar279 + fVar259 + fVar97;
  auVar235._0_4_ = fVar67 * 3.0;
  auVar235._4_4_ = fVar95 * 3.0;
  auVar235._8_4_ = fVar96 * 3.0;
  auVar235._12_4_ = fVar97 * 3.0;
  auVar162._0_4_ = *pfVar4 * 3.0;
  auVar162._4_4_ = pfVar4[1] * 3.0;
  auVar162._8_4_ = pfVar4[2] * 3.0;
  auVar162._12_4_ = pfVar4[3] * 3.0;
  auVar75 = vsubps_avx(auVar235,auVar162);
  auVar163._0_4_ = fVar272 + auVar75._0_4_;
  auVar163._4_4_ = fVar277 + auVar75._4_4_;
  auVar163._8_4_ = fVar278 + auVar75._8_4_;
  auVar163._12_4_ = fVar279 + auVar75._12_4_;
  auVar68 = vsubps_avx(auVar163,auVar225);
  auVar180._0_4_ = fVar177 * 0.0;
  auVar180._4_4_ = fVar147 * 0.0;
  auVar180._8_4_ = fVar193 * 0.0;
  auVar180._12_4_ = fVar157 * 0.0;
  auVar236._0_4_ = fVar293 + fVar285 + fVar194 + auVar180._0_4_;
  auVar236._4_4_ = fVar301 + fVar289 + fVar158 + auVar180._4_4_;
  auVar236._8_4_ = fVar302 + fVar290 + fVar195 + auVar180._8_4_;
  auVar236._12_4_ = fVar303 + fVar291 + fVar159 + auVar180._12_4_;
  auVar216._0_4_ = fVar194 * 3.0;
  auVar216._4_4_ = fVar158 * 3.0;
  auVar216._8_4_ = fVar195 * 3.0;
  auVar216._12_4_ = fVar159 * 3.0;
  auVar199._0_4_ = *pfVar2 * 3.0;
  auVar199._4_4_ = pfVar2[1] * 3.0;
  auVar199._8_4_ = pfVar2[2] * 3.0;
  auVar199._12_4_ = pfVar2[3] * 3.0;
  auVar75 = vsubps_avx(auVar216,auVar199);
  auVar200._0_4_ = fVar293 + auVar75._0_4_;
  auVar200._4_4_ = fVar301 + auVar75._4_4_;
  auVar200._8_4_ = fVar302 + auVar75._8_4_;
  auVar200._12_4_ = fVar303 + auVar75._12_4_;
  auVar69 = vsubps_avx(auVar200,auVar180);
  auVar75 = vshufps_avx(auVar129,auVar129,0xc9);
  auVar263 = vshufps_avx(auVar304,auVar304,0xc9);
  fVar260 = auVar129._0_4_;
  auVar217._0_4_ = fVar260 * auVar263._0_4_;
  fVar269 = auVar129._4_4_;
  auVar217._4_4_ = fVar269 * auVar263._4_4_;
  fVar270 = auVar129._8_4_;
  auVar217._8_4_ = fVar270 * auVar263._8_4_;
  fVar271 = auVar129._12_4_;
  auVar217._12_4_ = fVar271 * auVar263._12_4_;
  auVar226._0_4_ = auVar304._0_4_ * auVar75._0_4_;
  auVar226._4_4_ = auVar304._4_4_ * auVar75._4_4_;
  auVar226._8_4_ = auVar304._8_4_ * auVar75._8_4_;
  auVar226._12_4_ = auVar304._12_4_ * auVar75._12_4_;
  auVar263 = vsubps_avx(auVar226,auVar217);
  auVar16 = vshufps_avx(auVar263,auVar263,0xc9);
  auVar263 = vshufps_avx(auVar17,auVar17,0xc9);
  auVar218._0_4_ = fVar260 * auVar263._0_4_;
  auVar218._4_4_ = fVar269 * auVar263._4_4_;
  auVar218._8_4_ = fVar270 * auVar263._8_4_;
  auVar218._12_4_ = fVar271 * auVar263._12_4_;
  auVar181._0_4_ = auVar17._0_4_ * auVar75._0_4_;
  auVar181._4_4_ = auVar17._4_4_ * auVar75._4_4_;
  auVar181._8_4_ = auVar17._8_4_ * auVar75._8_4_;
  auVar181._12_4_ = auVar17._12_4_ * auVar75._12_4_;
  auVar75 = vsubps_avx(auVar181,auVar218);
  auVar17 = vshufps_avx(auVar75,auVar75,0xc9);
  auVar75 = vshufps_avx(auVar68,auVar68,0xc9);
  auVar263 = vshufps_avx(auVar236,auVar236,0xc9);
  fVar272 = auVar68._0_4_;
  auVar182._0_4_ = fVar272 * auVar263._0_4_;
  fVar277 = auVar68._4_4_;
  auVar182._4_4_ = fVar277 * auVar263._4_4_;
  fVar278 = auVar68._8_4_;
  auVar182._8_4_ = fVar278 * auVar263._8_4_;
  fVar279 = auVar68._12_4_;
  auVar182._12_4_ = fVar279 * auVar263._12_4_;
  auVar237._0_4_ = auVar236._0_4_ * auVar75._0_4_;
  auVar237._4_4_ = auVar236._4_4_ * auVar75._4_4_;
  auVar237._8_4_ = auVar236._8_4_ * auVar75._8_4_;
  auVar237._12_4_ = auVar236._12_4_ * auVar75._12_4_;
  auVar263 = vsubps_avx(auVar237,auVar182);
  auVar18 = vshufps_avx(auVar263,auVar263,0xc9);
  auVar263 = vshufps_avx(auVar69,auVar69,0xc9);
  auVar238._0_4_ = auVar263._0_4_ * fVar272;
  auVar238._4_4_ = auVar263._4_4_ * fVar277;
  auVar238._8_4_ = auVar263._8_4_ * fVar278;
  auVar238._12_4_ = auVar263._12_4_ * fVar279;
  auVar201._0_4_ = auVar75._0_4_ * auVar69._0_4_;
  auVar201._4_4_ = auVar75._4_4_ * auVar69._4_4_;
  auVar201._8_4_ = auVar75._8_4_ * auVar69._8_4_;
  auVar201._12_4_ = auVar75._12_4_ * auVar69._12_4_;
  auVar75 = vsubps_avx(auVar201,auVar238);
  auVar69 = vshufps_avx(auVar75,auVar75,0xc9);
  auVar75 = vdpps_avx(auVar16,auVar16,0x7f);
  fVar194 = auVar75._0_4_;
  auVar121 = ZEXT416((uint)fVar194);
  auVar263 = vrsqrtss_avx(auVar121,auVar121);
  fVar177 = auVar263._0_4_;
  auVar263 = vdpps_avx(auVar16,auVar17,0x7f);
  auVar104 = ZEXT416((uint)(fVar177 * 1.5 - fVar194 * 0.5 * fVar177 * fVar177 * fVar177));
  auVar104 = vshufps_avx(auVar104,auVar104,0);
  fVar177 = auVar16._0_4_ * auVar104._0_4_;
  fVar147 = auVar16._4_4_ * auVar104._4_4_;
  fVar193 = auVar16._8_4_ * auVar104._8_4_;
  fVar157 = auVar16._12_4_ * auVar104._12_4_;
  auVar75 = vshufps_avx(auVar75,auVar75,0);
  auVar252._0_4_ = auVar17._0_4_ * auVar75._0_4_;
  auVar252._4_4_ = auVar17._4_4_ * auVar75._4_4_;
  auVar252._8_4_ = auVar17._8_4_ * auVar75._8_4_;
  auVar252._12_4_ = auVar17._12_4_ * auVar75._12_4_;
  auVar75 = vshufps_avx(auVar263,auVar263,0);
  auVar227._0_4_ = auVar16._0_4_ * auVar75._0_4_;
  auVar227._4_4_ = auVar16._4_4_ * auVar75._4_4_;
  auVar227._8_4_ = auVar16._8_4_ * auVar75._8_4_;
  auVar227._12_4_ = auVar16._12_4_ * auVar75._12_4_;
  auVar99 = vsubps_avx(auVar252,auVar227);
  auVar75 = vrcpss_avx(auVar121,auVar121);
  auVar75 = ZEXT416((uint)(auVar75._0_4_ * (2.0 - fVar194 * auVar75._0_4_)));
  auVar16 = vshufps_avx(auVar75,auVar75,0);
  auVar75 = vdpps_avx(auVar18,auVar18,0x7f);
  fVar194 = auVar75._0_4_;
  auVar121 = ZEXT416((uint)fVar194);
  auVar263 = vrsqrtss_avx(auVar121,auVar121);
  fVar158 = auVar263._0_4_;
  auVar263 = ZEXT416((uint)(fVar158 * 1.5 - fVar194 * 0.5 * fVar158 * fVar158 * fVar158));
  auVar17 = vshufps_avx(auVar263,auVar263,0);
  fVar158 = auVar17._0_4_ * auVar18._0_4_;
  fVar195 = auVar17._4_4_ * auVar18._4_4_;
  fVar159 = auVar17._8_4_ * auVar18._8_4_;
  fVar196 = auVar17._12_4_ * auVar18._12_4_;
  auVar263 = vdpps_avx(auVar18,auVar69,0x7f);
  auVar75 = vshufps_avx(auVar75,auVar75,0);
  auVar219._0_4_ = auVar75._0_4_ * auVar69._0_4_;
  auVar219._4_4_ = auVar75._4_4_ * auVar69._4_4_;
  auVar219._8_4_ = auVar75._8_4_ * auVar69._8_4_;
  auVar219._12_4_ = auVar75._12_4_ * auVar69._12_4_;
  auVar75 = vshufps_avx(auVar263,auVar263,0);
  auVar183._0_4_ = auVar75._0_4_ * auVar18._0_4_;
  auVar183._4_4_ = auVar75._4_4_ * auVar18._4_4_;
  auVar183._8_4_ = auVar75._8_4_ * auVar18._8_4_;
  auVar183._12_4_ = auVar75._12_4_ * auVar18._12_4_;
  auVar69 = vsubps_avx(auVar219,auVar183);
  auVar75 = vrcpss_avx(auVar121,auVar121);
  auVar75 = ZEXT416((uint)((2.0 - fVar194 * auVar75._0_4_) * auVar75._0_4_));
  auVar75 = vshufps_avx(auVar75,auVar75,0);
  auVar263 = vshufps_avx(_local_700,_local_700,0xff);
  auVar239._0_4_ = auVar263._0_4_ * fVar177;
  auVar239._4_4_ = auVar263._4_4_ * fVar147;
  auVar239._8_4_ = auVar263._8_4_ * fVar193;
  auVar239._12_4_ = auVar263._12_4_ * fVar157;
  _local_4a0 = vsubps_avx(_local_700,auVar239);
  auVar18 = vshufps_avx(auVar129,auVar129,0xff);
  auVar202._0_4_ =
       auVar18._0_4_ * fVar177 + auVar104._0_4_ * auVar99._0_4_ * auVar16._0_4_ * auVar263._0_4_;
  auVar202._4_4_ =
       auVar18._4_4_ * fVar147 + auVar104._4_4_ * auVar99._4_4_ * auVar16._4_4_ * auVar263._4_4_;
  auVar202._8_4_ =
       auVar18._8_4_ * fVar193 + auVar104._8_4_ * auVar99._8_4_ * auVar16._8_4_ * auVar263._8_4_;
  auVar202._12_4_ =
       auVar18._12_4_ * fVar157 +
       auVar104._12_4_ * auVar99._12_4_ * auVar16._12_4_ * auVar263._12_4_;
  auVar18 = vsubps_avx(auVar129,auVar202);
  local_4b0._0_4_ = auVar239._0_4_ + (float)local_700._0_4_;
  local_4b0._4_4_ = auVar239._4_4_ + (float)local_700._4_4_;
  fStack_4a8 = auVar239._8_4_ + fStack_6f8;
  fStack_4a4 = auVar239._12_4_ + fStack_6f4;
  auVar263 = vshufps_avx(auVar151,auVar151,0xff);
  auVar125._0_4_ = fVar158 * auVar263._0_4_;
  auVar125._4_4_ = fVar195 * auVar263._4_4_;
  auVar125._8_4_ = fVar159 * auVar263._8_4_;
  auVar125._12_4_ = fVar196 * auVar263._12_4_;
  _local_4c0 = vsubps_avx(auVar151,auVar125);
  auVar16 = vshufps_avx(auVar68,auVar68,0xff);
  auVar100._0_4_ =
       fVar158 * auVar16._0_4_ + auVar263._0_4_ * auVar17._0_4_ * auVar69._0_4_ * auVar75._0_4_;
  auVar100._4_4_ =
       fVar195 * auVar16._4_4_ + auVar263._4_4_ * auVar17._4_4_ * auVar69._4_4_ * auVar75._4_4_;
  auVar100._8_4_ =
       fVar159 * auVar16._8_4_ + auVar263._8_4_ * auVar17._8_4_ * auVar69._8_4_ * auVar75._8_4_;
  auVar100._12_4_ =
       fVar196 * auVar16._12_4_ + auVar263._12_4_ * auVar17._12_4_ * auVar69._12_4_ * auVar75._12_4_
  ;
  auVar17 = vsubps_avx(auVar68,auVar100);
  fVar67 = auVar151._0_4_ + auVar125._0_4_;
  fVar95 = auVar151._4_4_ + auVar125._4_4_;
  fVar96 = auVar151._8_4_ + auVar125._8_4_;
  fVar97 = auVar151._12_4_ + auVar125._12_4_;
  local_4d0._0_4_ = local_4a0._0_4_ + auVar18._0_4_ * 0.33333334;
  local_4d0._4_4_ = local_4a0._4_4_ + auVar18._4_4_ * 0.33333334;
  fStack_4c8 = local_4a0._8_4_ + auVar18._8_4_ * 0.33333334;
  fStack_4c4 = local_4a0._12_4_ + auVar18._12_4_ * 0.33333334;
  local_3a0 = vsubps_avx(_local_4a0,auVar143);
  auVar263 = vmovsldup_avx(local_3a0);
  auVar75 = vmovshdup_avx(local_3a0);
  auVar16 = vshufps_avx(local_3a0,local_3a0,0xaa);
  fVar177 = pre->ray_space[k].vx.field_0.m128[0];
  fVar147 = pre->ray_space[k].vx.field_0.m128[1];
  fVar193 = pre->ray_space[k].vx.field_0.m128[2];
  fVar157 = pre->ray_space[k].vx.field_0.m128[3];
  fVar194 = pre->ray_space[k].vy.field_0.m128[0];
  fVar158 = pre->ray_space[k].vy.field_0.m128[1];
  fVar195 = pre->ray_space[k].vy.field_0.m128[2];
  fVar159 = pre->ray_space[k].vy.field_0.m128[3];
  fVar196 = pre->ray_space[k].vz.field_0.m128[0];
  fVar210 = pre->ray_space[k].vz.field_0.m128[1];
  fVar211 = pre->ray_space[k].vz.field_0.m128[2];
  fVar212 = pre->ray_space[k].vz.field_0.m128[3];
  fVar251 = fVar177 * auVar263._0_4_ + auVar16._0_4_ * fVar196 + fVar194 * auVar75._0_4_;
  fVar258 = fVar147 * auVar263._4_4_ + auVar16._4_4_ * fVar210 + fVar158 * auVar75._4_4_;
  local_700._4_4_ = fVar258;
  local_700._0_4_ = fVar251;
  fStack_6f8 = fVar193 * auVar263._8_4_ + auVar16._8_4_ * fVar211 + fVar195 * auVar75._8_4_;
  fStack_6f4 = fVar157 * auVar263._12_4_ + auVar16._12_4_ * fVar212 + fVar159 * auVar75._12_4_;
  local_3b0 = vsubps_avx(_local_4d0,auVar143);
  auVar16 = vshufps_avx(local_3b0,local_3b0,0xaa);
  auVar75 = vmovshdup_avx(local_3b0);
  auVar263 = vmovsldup_avx(local_3b0);
  fVar257 = auVar263._0_4_ * fVar177 + auVar75._0_4_ * fVar194 + fVar196 * auVar16._0_4_;
  fVar259 = auVar263._4_4_ * fVar147 + auVar75._4_4_ * fVar158 + fVar210 * auVar16._4_4_;
  local_6d0._4_4_ = fVar259;
  local_6d0._0_4_ = fVar257;
  fStack_6c8 = auVar263._8_4_ * fVar193 + auVar75._8_4_ * fVar195 + fVar211 * auVar16._8_4_;
  fStack_6c4 = auVar263._12_4_ * fVar157 + auVar75._12_4_ * fVar159 + fVar212 * auVar16._12_4_;
  auVar184._0_4_ = auVar17._0_4_ * 0.33333334;
  auVar184._4_4_ = auVar17._4_4_ * 0.33333334;
  auVar184._8_4_ = auVar17._8_4_ * 0.33333334;
  auVar184._12_4_ = auVar17._12_4_ * 0.33333334;
  _local_4e0 = vsubps_avx(_local_4c0,auVar184);
  local_3c0 = vsubps_avx(_local_4e0,auVar143);
  auVar16 = vshufps_avx(local_3c0,local_3c0,0xaa);
  auVar75 = vmovshdup_avx(local_3c0);
  auVar263 = vmovsldup_avx(local_3c0);
  auVar294._0_4_ = auVar263._0_4_ * fVar177 + auVar75._0_4_ * fVar194 + fVar196 * auVar16._0_4_;
  auVar294._4_4_ = auVar263._4_4_ * fVar147 + auVar75._4_4_ * fVar158 + fVar210 * auVar16._4_4_;
  auVar294._8_4_ = auVar263._8_4_ * fVar193 + auVar75._8_4_ * fVar195 + fVar211 * auVar16._8_4_;
  auVar294._12_4_ = auVar263._12_4_ * fVar157 + auVar75._12_4_ * fVar159 + fVar212 * auVar16._12_4_;
  local_3d0 = vsubps_avx(_local_4c0,auVar143);
  auVar16 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar75 = vmovshdup_avx(local_3d0);
  auVar263 = vmovsldup_avx(local_3d0);
  auVar287._0_4_ = auVar263._0_4_ * fVar177 + auVar75._0_4_ * fVar194 + auVar16._0_4_ * fVar196;
  auVar287._4_4_ = auVar263._4_4_ * fVar147 + auVar75._4_4_ * fVar158 + auVar16._4_4_ * fVar210;
  auVar287._8_4_ = auVar263._8_4_ * fVar193 + auVar75._8_4_ * fVar195 + auVar16._8_4_ * fVar211;
  auVar287._12_4_ = auVar263._12_4_ * fVar157 + auVar75._12_4_ * fVar159 + auVar16._12_4_ * fVar212;
  local_3e0 = vsubps_avx(_local_4b0,auVar143);
  auVar16 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar75 = vmovshdup_avx(local_3e0);
  auVar263 = vmovsldup_avx(local_3e0);
  auVar274._0_4_ = auVar263._0_4_ * fVar177 + auVar75._0_4_ * fVar194 + auVar16._0_4_ * fVar196;
  auVar274._4_4_ = auVar263._4_4_ * fVar147 + auVar75._4_4_ * fVar158 + auVar16._4_4_ * fVar210;
  auVar274._8_4_ = auVar263._8_4_ * fVar193 + auVar75._8_4_ * fVar195 + auVar16._8_4_ * fVar211;
  auVar274._12_4_ = auVar263._12_4_ * fVar157 + auVar75._12_4_ * fVar159 + auVar16._12_4_ * fVar212;
  local_4f0._0_4_ = (float)local_4b0._0_4_ + (fVar260 + auVar202._0_4_) * 0.33333334;
  local_4f0._4_4_ = (float)local_4b0._4_4_ + (fVar269 + auVar202._4_4_) * 0.33333334;
  fStack_4e8 = fStack_4a8 + (fVar270 + auVar202._8_4_) * 0.33333334;
  fStack_4e4 = fStack_4a4 + (fVar271 + auVar202._12_4_) * 0.33333334;
  local_3f0 = vsubps_avx(_local_4f0,auVar143);
  auVar16 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar75 = vmovshdup_avx(local_3f0);
  auVar263 = vmovsldup_avx(local_3f0);
  auVar228._0_4_ = auVar263._0_4_ * fVar177 + auVar75._0_4_ * fVar194 + auVar16._0_4_ * fVar196;
  auVar228._4_4_ = auVar263._4_4_ * fVar147 + auVar75._4_4_ * fVar158 + auVar16._4_4_ * fVar210;
  auVar228._8_4_ = auVar263._8_4_ * fVar193 + auVar75._8_4_ * fVar195 + auVar16._8_4_ * fVar211;
  auVar228._12_4_ = auVar263._12_4_ * fVar157 + auVar75._12_4_ * fVar159 + auVar16._12_4_ * fVar212;
  auVar220._0_4_ = (fVar272 + auVar100._0_4_) * 0.33333334;
  auVar220._4_4_ = (fVar277 + auVar100._4_4_) * 0.33333334;
  auVar220._8_4_ = (fVar278 + auVar100._8_4_) * 0.33333334;
  auVar220._12_4_ = (fVar279 + auVar100._12_4_) * 0.33333334;
  auVar57._4_4_ = fVar95;
  auVar57._0_4_ = fVar67;
  auVar57._8_4_ = fVar96;
  auVar57._12_4_ = fVar97;
  _local_430 = vsubps_avx(auVar57,auVar220);
  local_400 = vsubps_avx(_local_430,auVar143);
  auVar16 = vshufps_avx(local_400,local_400,0xaa);
  auVar75 = vmovshdup_avx(local_400);
  auVar263 = vmovsldup_avx(local_400);
  auVar101._0_4_ = auVar263._0_4_ * fVar177 + auVar75._0_4_ * fVar194 + fVar196 * auVar16._0_4_;
  auVar101._4_4_ = auVar263._4_4_ * fVar147 + auVar75._4_4_ * fVar158 + fVar210 * auVar16._4_4_;
  auVar101._8_4_ = auVar263._8_4_ * fVar193 + auVar75._8_4_ * fVar195 + fVar211 * auVar16._8_4_;
  auVar101._12_4_ = auVar263._12_4_ * fVar157 + auVar75._12_4_ * fVar159 + fVar212 * auVar16._12_4_;
  local_410 = vsubps_avx(auVar57,auVar143);
  auVar143 = vshufps_avx(local_410,local_410,0xaa);
  auVar75 = vmovshdup_avx(local_410);
  auVar263 = vmovsldup_avx(local_410);
  auVar70._0_4_ = fVar177 * auVar263._0_4_ + fVar194 * auVar75._0_4_ + fVar196 * auVar143._0_4_;
  auVar70._4_4_ = fVar147 * auVar263._4_4_ + fVar158 * auVar75._4_4_ + fVar210 * auVar143._4_4_;
  auVar70._8_4_ = fVar193 * auVar263._8_4_ + fVar195 * auVar75._8_4_ + fVar211 * auVar143._8_4_;
  auVar70._12_4_ = fVar157 * auVar263._12_4_ + fVar159 * auVar75._12_4_ + fVar212 * auVar143._12_4_;
  auVar16 = vmovlhps_avx(_local_700,auVar274);
  auVar17 = vmovlhps_avx(_local_6d0,auVar228);
  auVar18 = vmovlhps_avx(auVar294,auVar101);
  _local_380 = vmovlhps_avx(auVar287,auVar70);
  auVar75 = vminps_avx(auVar16,auVar17);
  auVar263 = vminps_avx(auVar18,_local_380);
  auVar143 = vminps_avx(auVar75,auVar263);
  auVar75 = vmaxps_avx(auVar16,auVar17);
  auVar263 = vmaxps_avx(auVar18,_local_380);
  auVar75 = vmaxps_avx(auVar75,auVar263);
  auVar263 = vshufpd_avx(auVar143,auVar143,3);
  auVar143 = vminps_avx(auVar143,auVar263);
  auVar263 = vshufpd_avx(auVar75,auVar75,3);
  auVar263 = vmaxps_avx(auVar75,auVar263);
  auVar203._8_4_ = 0x7fffffff;
  auVar203._0_8_ = 0x7fffffff7fffffff;
  auVar203._12_4_ = 0x7fffffff;
  auVar75 = vandps_avx(auVar143,auVar203);
  auVar263 = vandps_avx(auVar263,auVar203);
  auVar75 = vmaxps_avx(auVar75,auVar263);
  auVar263 = vmovshdup_avx(auVar75);
  auVar75 = vmaxss_avx(auVar263,auVar75);
  fVar177 = auVar75._0_4_ * 9.536743e-07;
  local_390 = ZEXT416((uint)fVar177);
  auVar75 = vshufps_avx(ZEXT416((uint)fVar177),ZEXT416((uint)fVar177),0);
  local_1c0._16_16_ = auVar75;
  local_1c0._0_16_ = auVar75;
  auVar71._0_8_ = auVar75._0_8_ ^ 0x8000000080000000;
  auVar71._8_4_ = auVar75._8_4_ ^ 0x80000000;
  auVar71._12_4_ = auVar75._12_4_ ^ 0x80000000;
  local_1e0._16_16_ = auVar71;
  local_1e0._0_16_ = auVar71;
  auVar75 = vpshufd_avx(ZEXT416(uVar59),0);
  local_300._16_16_ = auVar75;
  local_300._0_16_ = auVar75;
  auVar75 = vpshufd_avx(ZEXT416(uVar10),0);
  local_320._16_16_ = auVar75;
  local_320._0_16_ = auVar75;
  uVar65 = 0;
  fVar177 = *(float *)(ray + k * 4 + 0x60);
  _local_350 = vsubps_avx(auVar17,auVar16);
  _local_360 = vsubps_avx(auVar18,auVar17);
  _local_370 = vsubps_avx(_local_380,auVar18);
  _local_440 = vsubps_avx(_local_4b0,_local_4a0);
  _local_450 = vsubps_avx(_local_4f0,_local_4d0);
  _local_460 = vsubps_avx(_local_430,_local_4e0);
  auVar58._4_4_ = fVar95;
  auVar58._0_4_ = fVar67;
  auVar58._8_4_ = fVar96;
  auVar58._12_4_ = fVar97;
  _local_470 = vsubps_avx(auVar58,_local_4c0);
  auVar300 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar306 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_007a462b:
  do {
    local_420 = auVar306._0_16_;
    auVar122 = auVar300._0_16_;
    auVar75 = vshufps_avx(auVar122,auVar122,0x50);
    auVar295._8_4_ = 0x3f800000;
    auVar295._0_8_ = 0x3f8000003f800000;
    auVar295._12_4_ = 0x3f800000;
    auVar299._16_4_ = 0x3f800000;
    auVar299._0_16_ = auVar295;
    auVar299._20_4_ = 0x3f800000;
    auVar299._24_4_ = 0x3f800000;
    auVar299._28_4_ = 0x3f800000;
    auVar263 = vsubps_avx(auVar295,auVar75);
    fVar147 = auVar75._0_4_;
    fVar193 = auVar75._4_4_;
    fVar157 = auVar75._8_4_;
    fVar194 = auVar75._12_4_;
    fVar158 = auVar263._0_4_;
    fVar195 = auVar263._4_4_;
    fVar159 = auVar263._8_4_;
    fVar196 = auVar263._12_4_;
    auVar152._0_4_ = auVar274._0_4_ * fVar147 + fVar158 * fVar251;
    auVar152._4_4_ = auVar274._4_4_ * fVar193 + fVar195 * fVar258;
    auVar152._8_4_ = auVar274._0_4_ * fVar157 + fVar159 * fVar251;
    auVar152._12_4_ = auVar274._4_4_ * fVar194 + fVar196 * fVar258;
    auVar126._0_4_ = auVar228._0_4_ * fVar147 + fVar158 * fVar257;
    auVar126._4_4_ = auVar228._4_4_ * fVar193 + fVar195 * fVar259;
    auVar126._8_4_ = auVar228._0_4_ * fVar157 + fVar159 * fVar257;
    auVar126._12_4_ = auVar228._4_4_ * fVar194 + fVar196 * fVar259;
    auVar221._0_4_ = auVar101._0_4_ * fVar147 + auVar294._0_4_ * fVar158;
    auVar221._4_4_ = auVar101._4_4_ * fVar193 + auVar294._4_4_ * fVar195;
    auVar221._8_4_ = auVar101._0_4_ * fVar157 + auVar294._0_4_ * fVar159;
    auVar221._12_4_ = auVar101._4_4_ * fVar194 + auVar294._4_4_ * fVar196;
    auVar164._0_4_ = auVar70._0_4_ * fVar147 + auVar287._0_4_ * fVar158;
    auVar164._4_4_ = auVar70._4_4_ * fVar193 + auVar287._4_4_ * fVar195;
    auVar164._8_4_ = auVar70._0_4_ * fVar157 + auVar287._0_4_ * fVar159;
    auVar164._12_4_ = auVar70._4_4_ * fVar194 + auVar287._4_4_ * fVar196;
    auVar75 = vmovshdup_avx(local_420);
    auVar263 = vshufps_avx(local_420,local_420,0);
    auVar243._16_16_ = auVar263;
    auVar243._0_16_ = auVar263;
    auVar143 = vshufps_avx(local_420,local_420,0x55);
    auVar88._16_16_ = auVar143;
    auVar88._0_16_ = auVar143;
    auVar87 = vsubps_avx(auVar88,auVar243);
    auVar143 = vshufps_avx(auVar152,auVar152,0);
    auVar69 = vshufps_avx(auVar152,auVar152,0x55);
    auVar104 = vshufps_avx(auVar126,auVar126,0);
    auVar129 = vshufps_avx(auVar126,auVar126,0x55);
    auVar68 = vshufps_avx(auVar221,auVar221,0);
    auVar99 = vshufps_avx(auVar221,auVar221,0x55);
    auVar121 = vshufps_avx(auVar164,auVar164,0);
    auVar98 = vshufps_avx(auVar164,auVar164,0x55);
    auVar75 = ZEXT416((uint)((auVar75._0_4_ - auVar306._0_4_) * 0.04761905));
    auVar75 = vshufps_avx(auVar75,auVar75,0);
    auVar256._0_4_ = auVar263._0_4_ + auVar87._0_4_ * 0.0;
    auVar256._4_4_ = auVar263._4_4_ + auVar87._4_4_ * 0.14285715;
    auVar256._8_4_ = auVar263._8_4_ + auVar87._8_4_ * 0.2857143;
    auVar256._12_4_ = auVar263._12_4_ + auVar87._12_4_ * 0.42857146;
    auVar256._16_4_ = auVar263._0_4_ + auVar87._16_4_ * 0.5714286;
    auVar256._20_4_ = auVar263._4_4_ + auVar87._20_4_ * 0.71428573;
    auVar256._24_4_ = auVar263._8_4_ + auVar87._24_4_ * 0.8571429;
    auVar256._28_4_ = auVar263._12_4_ + auVar87._28_4_;
    auVar19 = vsubps_avx(auVar299,auVar256);
    fVar147 = auVar104._0_4_;
    fVar157 = auVar104._4_4_;
    fVar158 = auVar104._8_4_;
    fVar159 = auVar104._12_4_;
    fVar233 = auVar19._0_4_;
    fVar245 = auVar19._4_4_;
    fVar246 = auVar19._8_4_;
    fVar247 = auVar19._12_4_;
    fVar248 = auVar19._16_4_;
    fVar249 = auVar19._20_4_;
    fVar250 = auVar19._24_4_;
    fVar289 = auVar129._0_4_;
    fVar291 = auVar129._4_4_;
    fVar301 = auVar129._8_4_;
    fVar303 = auVar129._12_4_;
    fVar292 = auVar69._12_4_ + 1.0;
    fVar277 = auVar68._0_4_;
    fVar278 = auVar68._4_4_;
    fVar279 = auVar68._8_4_;
    fVar285 = auVar68._12_4_;
    fVar210 = fVar277 * auVar256._0_4_ + fVar233 * fVar147;
    fVar211 = fVar278 * auVar256._4_4_ + fVar245 * fVar157;
    fVar212 = fVar279 * auVar256._8_4_ + fVar246 * fVar158;
    fVar260 = fVar285 * auVar256._12_4_ + fVar247 * fVar159;
    fVar269 = fVar277 * auVar256._16_4_ + fVar248 * fVar147;
    fVar270 = fVar278 * auVar256._20_4_ + fVar249 * fVar157;
    fVar271 = fVar279 * auVar256._24_4_ + fVar250 * fVar158;
    fVar193 = auVar99._0_4_;
    fVar194 = auVar99._4_4_;
    fVar195 = auVar99._8_4_;
    fVar196 = auVar99._12_4_;
    fVar290 = fVar289 * fVar233 + auVar256._0_4_ * fVar193;
    fVar293 = fVar291 * fVar245 + auVar256._4_4_ * fVar194;
    fVar302 = fVar301 * fVar246 + auVar256._8_4_ * fVar195;
    fVar280 = fVar303 * fVar247 + auVar256._12_4_ * fVar196;
    fVar281 = fVar289 * fVar248 + auVar256._16_4_ * fVar193;
    fVar282 = fVar291 * fVar249 + auVar256._20_4_ * fVar194;
    fVar283 = fVar301 * fVar250 + auVar256._24_4_ * fVar195;
    fVar284 = fVar303 + fVar159;
    auVar263 = vshufps_avx(auVar152,auVar152,0xaa);
    auVar104 = vshufps_avx(auVar152,auVar152,0xff);
    fVar272 = fVar285 + 0.0;
    auVar129 = vshufps_avx(auVar126,auVar126,0xaa);
    auVar68 = vshufps_avx(auVar126,auVar126,0xff);
    auVar175._0_4_ =
         fVar233 * (auVar256._0_4_ * fVar147 + fVar233 * auVar143._0_4_) + auVar256._0_4_ * fVar210;
    auVar175._4_4_ =
         fVar245 * (auVar256._4_4_ * fVar157 + fVar245 * auVar143._4_4_) + auVar256._4_4_ * fVar211;
    auVar175._8_4_ =
         fVar246 * (auVar256._8_4_ * fVar158 + fVar246 * auVar143._8_4_) + auVar256._8_4_ * fVar212;
    auVar175._12_4_ =
         fVar247 * (auVar256._12_4_ * fVar159 + fVar247 * auVar143._12_4_) +
         auVar256._12_4_ * fVar260;
    auVar175._16_4_ =
         fVar248 * (auVar256._16_4_ * fVar147 + fVar248 * auVar143._0_4_) +
         auVar256._16_4_ * fVar269;
    auVar175._20_4_ =
         fVar249 * (auVar256._20_4_ * fVar157 + fVar249 * auVar143._4_4_) +
         auVar256._20_4_ * fVar270;
    auVar175._24_4_ =
         fVar250 * (auVar256._24_4_ * fVar158 + fVar250 * auVar143._8_4_) +
         auVar256._24_4_ * fVar271;
    auVar175._28_4_ = auVar143._12_4_ + 1.0 + fVar196;
    auVar191._0_4_ =
         fVar233 * (fVar289 * auVar256._0_4_ + auVar69._0_4_ * fVar233) + auVar256._0_4_ * fVar290;
    auVar191._4_4_ =
         fVar245 * (fVar291 * auVar256._4_4_ + auVar69._4_4_ * fVar245) + auVar256._4_4_ * fVar293;
    auVar191._8_4_ =
         fVar246 * (fVar301 * auVar256._8_4_ + auVar69._8_4_ * fVar246) + auVar256._8_4_ * fVar302;
    auVar191._12_4_ =
         fVar247 * (fVar303 * auVar256._12_4_ + auVar69._12_4_ * fVar247) +
         auVar256._12_4_ * fVar280;
    auVar191._16_4_ =
         fVar248 * (fVar289 * auVar256._16_4_ + auVar69._0_4_ * fVar248) + auVar256._16_4_ * fVar281
    ;
    auVar191._20_4_ =
         fVar249 * (fVar291 * auVar256._20_4_ + auVar69._4_4_ * fVar249) + auVar256._20_4_ * fVar282
    ;
    auVar191._24_4_ =
         fVar250 * (fVar301 * auVar256._24_4_ + auVar69._8_4_ * fVar250) + auVar256._24_4_ * fVar283
    ;
    auVar191._28_4_ = auVar98._12_4_ + fVar196;
    auVar89._0_4_ =
         fVar233 * fVar210 + auVar256._0_4_ * (fVar277 * fVar233 + auVar121._0_4_ * auVar256._0_4_);
    auVar89._4_4_ =
         fVar245 * fVar211 + auVar256._4_4_ * (fVar278 * fVar245 + auVar121._4_4_ * auVar256._4_4_);
    auVar89._8_4_ =
         fVar246 * fVar212 + auVar256._8_4_ * (fVar279 * fVar246 + auVar121._8_4_ * auVar256._8_4_);
    auVar89._12_4_ =
         fVar247 * fVar260 +
         auVar256._12_4_ * (fVar285 * fVar247 + auVar121._12_4_ * auVar256._12_4_);
    auVar89._16_4_ =
         fVar248 * fVar269 +
         auVar256._16_4_ * (fVar277 * fVar248 + auVar121._0_4_ * auVar256._16_4_);
    auVar89._20_4_ =
         fVar249 * fVar270 +
         auVar256._20_4_ * (fVar278 * fVar249 + auVar121._4_4_ * auVar256._20_4_);
    auVar89._24_4_ =
         fVar250 * fVar271 +
         auVar256._24_4_ * (fVar279 * fVar250 + auVar121._8_4_ * auVar256._24_4_);
    auVar89._28_4_ = fVar159 + 1.0 + fVar272;
    auVar268._0_4_ =
         fVar233 * fVar290 + auVar256._0_4_ * (auVar98._0_4_ * auVar256._0_4_ + fVar233 * fVar193);
    auVar268._4_4_ =
         fVar245 * fVar293 + auVar256._4_4_ * (auVar98._4_4_ * auVar256._4_4_ + fVar245 * fVar194);
    auVar268._8_4_ =
         fVar246 * fVar302 + auVar256._8_4_ * (auVar98._8_4_ * auVar256._8_4_ + fVar246 * fVar195);
    auVar268._12_4_ =
         fVar247 * fVar280 +
         auVar256._12_4_ * (auVar98._12_4_ * auVar256._12_4_ + fVar247 * fVar196);
    auVar268._16_4_ =
         fVar248 * fVar281 + auVar256._16_4_ * (auVar98._0_4_ * auVar256._16_4_ + fVar248 * fVar193)
    ;
    auVar268._20_4_ =
         fVar249 * fVar282 + auVar256._20_4_ * (auVar98._4_4_ * auVar256._20_4_ + fVar249 * fVar194)
    ;
    auVar268._24_4_ =
         fVar250 * fVar283 + auVar256._24_4_ * (auVar98._8_4_ * auVar256._24_4_ + fVar250 * fVar195)
    ;
    auVar268._28_4_ = fVar272 + fVar196 + 0.0;
    local_220._0_4_ = fVar233 * auVar175._0_4_ + auVar256._0_4_ * auVar89._0_4_;
    local_220._4_4_ = fVar245 * auVar175._4_4_ + auVar256._4_4_ * auVar89._4_4_;
    local_220._8_4_ = fVar246 * auVar175._8_4_ + auVar256._8_4_ * auVar89._8_4_;
    local_220._12_4_ = fVar247 * auVar175._12_4_ + auVar256._12_4_ * auVar89._12_4_;
    local_220._16_4_ = fVar248 * auVar175._16_4_ + auVar256._16_4_ * auVar89._16_4_;
    local_220._20_4_ = fVar249 * auVar175._20_4_ + auVar256._20_4_ * auVar89._20_4_;
    local_220._24_4_ = fVar250 * auVar175._24_4_ + auVar256._24_4_ * auVar89._24_4_;
    local_220._28_4_ = fVar284 + fVar196 + 0.0;
    auVar156._0_4_ = fVar233 * auVar191._0_4_ + auVar256._0_4_ * auVar268._0_4_;
    auVar156._4_4_ = fVar245 * auVar191._4_4_ + auVar256._4_4_ * auVar268._4_4_;
    auVar156._8_4_ = fVar246 * auVar191._8_4_ + auVar256._8_4_ * auVar268._8_4_;
    auVar156._12_4_ = fVar247 * auVar191._12_4_ + auVar256._12_4_ * auVar268._12_4_;
    auVar156._16_4_ = fVar248 * auVar191._16_4_ + auVar256._16_4_ * auVar268._16_4_;
    auVar156._20_4_ = fVar249 * auVar191._20_4_ + auVar256._20_4_ * auVar268._20_4_;
    auVar156._24_4_ = fVar250 * auVar191._24_4_ + auVar256._24_4_ * auVar268._24_4_;
    auVar156._28_4_ = fVar284 + fVar272;
    auVar20 = vsubps_avx(auVar89,auVar175);
    auVar87 = vsubps_avx(auVar268,auVar191);
    local_680 = auVar75._0_4_;
    fStack_67c = auVar75._4_4_;
    fStack_678 = auVar75._8_4_;
    fStack_674 = auVar75._12_4_;
    local_260 = local_680 * auVar20._0_4_ * 3.0;
    fStack_25c = fStack_67c * auVar20._4_4_ * 3.0;
    auVar21._4_4_ = fStack_25c;
    auVar21._0_4_ = local_260;
    fStack_258 = fStack_678 * auVar20._8_4_ * 3.0;
    auVar21._8_4_ = fStack_258;
    fStack_254 = fStack_674 * auVar20._12_4_ * 3.0;
    auVar21._12_4_ = fStack_254;
    fStack_250 = local_680 * auVar20._16_4_ * 3.0;
    auVar21._16_4_ = fStack_250;
    fStack_24c = fStack_67c * auVar20._20_4_ * 3.0;
    auVar21._20_4_ = fStack_24c;
    fStack_248 = fStack_678 * auVar20._24_4_ * 3.0;
    auVar21._24_4_ = fStack_248;
    auVar21._28_4_ = auVar20._28_4_;
    local_280 = local_680 * auVar87._0_4_ * 3.0;
    fStack_27c = fStack_67c * auVar87._4_4_ * 3.0;
    auVar22._4_4_ = fStack_27c;
    auVar22._0_4_ = local_280;
    fStack_278 = fStack_678 * auVar87._8_4_ * 3.0;
    auVar22._8_4_ = fStack_278;
    fStack_274 = fStack_674 * auVar87._12_4_ * 3.0;
    auVar22._12_4_ = fStack_274;
    fStack_270 = local_680 * auVar87._16_4_ * 3.0;
    auVar22._16_4_ = fStack_270;
    fStack_26c = fStack_67c * auVar87._20_4_ * 3.0;
    auVar22._20_4_ = fStack_26c;
    fStack_268 = fStack_678 * auVar87._24_4_ * 3.0;
    auVar22._24_4_ = fStack_268;
    auVar22._28_4_ = fVar284;
    auVar21 = vsubps_avx(local_220,auVar21);
    auVar87 = vperm2f128_avx(auVar21,auVar21,1);
    auVar87 = vshufps_avx(auVar87,auVar21,0x30);
    auVar87 = vshufps_avx(auVar21,auVar87,0x29);
    auVar22 = vsubps_avx(auVar156,auVar22);
    auVar21 = vperm2f128_avx(auVar22,auVar22,1);
    auVar21 = vshufps_avx(auVar21,auVar22,0x30);
    auVar22 = vshufps_avx(auVar22,auVar21,0x29);
    fVar282 = auVar129._0_4_;
    fVar283 = auVar129._4_4_;
    fVar307 = auVar129._8_4_;
    fVar159 = auVar263._12_4_;
    fVar278 = auVar68._0_4_;
    fVar285 = auVar68._4_4_;
    fVar290 = auVar68._8_4_;
    fVar293 = auVar68._12_4_;
    auVar75 = vshufps_avx(auVar221,auVar221,0xaa);
    fVar147 = auVar75._0_4_;
    fVar157 = auVar75._4_4_;
    fVar158 = auVar75._8_4_;
    fVar196 = auVar75._12_4_;
    fVar212 = auVar256._0_4_ * fVar147 + fVar282 * fVar233;
    fVar260 = auVar256._4_4_ * fVar157 + fVar283 * fVar245;
    fVar269 = auVar256._8_4_ * fVar158 + fVar307 * fVar246;
    fVar270 = auVar256._12_4_ * fVar196 + auVar129._12_4_ * fVar247;
    fVar271 = auVar256._16_4_ * fVar147 + fVar282 * fVar248;
    fVar272 = auVar256._20_4_ * fVar157 + fVar283 * fVar249;
    fVar277 = auVar256._24_4_ * fVar158 + fVar307 * fVar250;
    auVar75 = vshufps_avx(auVar221,auVar221,0xff);
    fVar193 = auVar75._0_4_;
    fVar194 = auVar75._4_4_;
    fVar195 = auVar75._8_4_;
    fVar210 = auVar75._12_4_;
    fVar279 = auVar256._0_4_ * fVar193 + fVar278 * fVar233;
    fVar289 = auVar256._4_4_ * fVar194 + fVar285 * fVar245;
    fVar291 = auVar256._8_4_ * fVar195 + fVar290 * fVar246;
    fVar301 = auVar256._12_4_ * fVar210 + fVar293 * fVar247;
    fVar302 = auVar256._16_4_ * fVar193 + fVar278 * fVar248;
    fVar303 = auVar256._20_4_ * fVar194 + fVar285 * fVar249;
    fVar280 = auVar256._24_4_ * fVar195 + fVar290 * fVar250;
    auVar75 = vshufps_avx(auVar164,auVar164,0xaa);
    fVar281 = auVar75._12_4_ + fVar196;
    auVar143 = vshufps_avx(auVar164,auVar164,0xff);
    fVar211 = auVar143._12_4_;
    auVar90._0_4_ =
         fVar233 * (fVar282 * auVar256._0_4_ + fVar233 * auVar263._0_4_) + auVar256._0_4_ * fVar212;
    auVar90._4_4_ =
         fVar245 * (fVar283 * auVar256._4_4_ + fVar245 * auVar263._4_4_) + auVar256._4_4_ * fVar260;
    auVar90._8_4_ =
         fVar246 * (fVar307 * auVar256._8_4_ + fVar246 * auVar263._8_4_) + auVar256._8_4_ * fVar269;
    auVar90._12_4_ =
         fVar247 * (auVar129._12_4_ * auVar256._12_4_ + fVar247 * fVar159) +
         auVar256._12_4_ * fVar270;
    auVar90._16_4_ =
         fVar248 * (fVar282 * auVar256._16_4_ + fVar248 * auVar263._0_4_) +
         auVar256._16_4_ * fVar271;
    auVar90._20_4_ =
         fVar249 * (fVar283 * auVar256._20_4_ + fVar249 * auVar263._4_4_) +
         auVar256._20_4_ * fVar272;
    auVar90._24_4_ =
         fVar250 * (fVar307 * auVar256._24_4_ + fVar250 * auVar263._8_4_) +
         auVar256._24_4_ * fVar277;
    auVar90._28_4_ = auVar22._28_4_ + fVar159 + fVar211;
    auVar117._0_4_ =
         fVar233 * (fVar278 * auVar256._0_4_ + auVar104._0_4_ * fVar233) + auVar256._0_4_ * fVar279;
    auVar117._4_4_ =
         fVar245 * (fVar285 * auVar256._4_4_ + auVar104._4_4_ * fVar245) + auVar256._4_4_ * fVar289;
    auVar117._8_4_ =
         fVar246 * (fVar290 * auVar256._8_4_ + auVar104._8_4_ * fVar246) + auVar256._8_4_ * fVar291;
    auVar117._12_4_ =
         fVar247 * (fVar293 * auVar256._12_4_ + auVar104._12_4_ * fVar247) +
         auVar256._12_4_ * fVar301;
    auVar117._16_4_ =
         fVar248 * (fVar278 * auVar256._16_4_ + auVar104._0_4_ * fVar248) +
         auVar256._16_4_ * fVar302;
    auVar117._20_4_ =
         fVar249 * (fVar285 * auVar256._20_4_ + auVar104._4_4_ * fVar249) +
         auVar256._20_4_ * fVar303;
    auVar117._24_4_ =
         fVar250 * (fVar290 * auVar256._24_4_ + auVar104._8_4_ * fVar250) +
         auVar256._24_4_ * fVar280;
    auVar117._28_4_ = fVar159 + auVar21._28_4_ + fVar211;
    auVar21 = vperm2f128_avx(local_220,local_220,1);
    auVar21 = vshufps_avx(auVar21,local_220,0x30);
    _local_520 = vshufps_avx(local_220,auVar21,0x29);
    auVar192._0_4_ =
         auVar256._0_4_ * (auVar75._0_4_ * auVar256._0_4_ + fVar233 * fVar147) + fVar233 * fVar212;
    auVar192._4_4_ =
         auVar256._4_4_ * (auVar75._4_4_ * auVar256._4_4_ + fVar245 * fVar157) + fVar245 * fVar260;
    auVar192._8_4_ =
         auVar256._8_4_ * (auVar75._8_4_ * auVar256._8_4_ + fVar246 * fVar158) + fVar246 * fVar269;
    auVar192._12_4_ =
         auVar256._12_4_ * (auVar75._12_4_ * auVar256._12_4_ + fVar247 * fVar196) +
         fVar247 * fVar270;
    auVar192._16_4_ =
         auVar256._16_4_ * (auVar75._0_4_ * auVar256._16_4_ + fVar248 * fVar147) + fVar248 * fVar271
    ;
    auVar192._20_4_ =
         auVar256._20_4_ * (auVar75._4_4_ * auVar256._20_4_ + fVar249 * fVar157) + fVar249 * fVar272
    ;
    auVar192._24_4_ =
         auVar256._24_4_ * (auVar75._8_4_ * auVar256._24_4_ + fVar250 * fVar158) + fVar250 * fVar277
    ;
    auVar192._28_4_ = fVar281 + fVar292 + auVar191._28_4_;
    auVar232._0_4_ =
         fVar233 * fVar279 + auVar256._0_4_ * (auVar256._0_4_ * auVar143._0_4_ + fVar233 * fVar193);
    auVar232._4_4_ =
         fVar245 * fVar289 + auVar256._4_4_ * (auVar256._4_4_ * auVar143._4_4_ + fVar245 * fVar194);
    auVar232._8_4_ =
         fVar246 * fVar291 + auVar256._8_4_ * (auVar256._8_4_ * auVar143._8_4_ + fVar246 * fVar195);
    auVar232._12_4_ =
         fVar247 * fVar301 + auVar256._12_4_ * (auVar256._12_4_ * fVar211 + fVar247 * fVar210);
    auVar232._16_4_ =
         fVar248 * fVar302 +
         auVar256._16_4_ * (auVar256._16_4_ * auVar143._0_4_ + fVar248 * fVar193);
    auVar232._20_4_ =
         fVar249 * fVar303 +
         auVar256._20_4_ * (auVar256._20_4_ * auVar143._4_4_ + fVar249 * fVar194);
    auVar232._24_4_ =
         fVar250 * fVar280 +
         auVar256._24_4_ * (auVar256._24_4_ * auVar143._8_4_ + fVar250 * fVar195);
    auVar232._28_4_ = fVar292 + fVar293 + fVar211 + fVar210;
    auVar224._0_4_ = fVar233 * auVar90._0_4_ + auVar256._0_4_ * auVar192._0_4_;
    auVar224._4_4_ = fVar245 * auVar90._4_4_ + auVar256._4_4_ * auVar192._4_4_;
    auVar224._8_4_ = fVar246 * auVar90._8_4_ + auVar256._8_4_ * auVar192._8_4_;
    auVar224._12_4_ = fVar247 * auVar90._12_4_ + auVar256._12_4_ * auVar192._12_4_;
    auVar224._16_4_ = fVar248 * auVar90._16_4_ + auVar256._16_4_ * auVar192._16_4_;
    auVar224._20_4_ = fVar249 * auVar90._20_4_ + auVar256._20_4_ * auVar192._20_4_;
    auVar224._24_4_ = fVar250 * auVar90._24_4_ + auVar256._24_4_ * auVar192._24_4_;
    auVar224._28_4_ = fVar281 + fVar211 + fVar210;
    auVar244._0_4_ = fVar233 * auVar117._0_4_ + auVar256._0_4_ * auVar232._0_4_;
    auVar244._4_4_ = fVar245 * auVar117._4_4_ + auVar256._4_4_ * auVar232._4_4_;
    auVar244._8_4_ = fVar246 * auVar117._8_4_ + auVar256._8_4_ * auVar232._8_4_;
    auVar244._12_4_ = fVar247 * auVar117._12_4_ + auVar256._12_4_ * auVar232._12_4_;
    auVar244._16_4_ = fVar248 * auVar117._16_4_ + auVar256._16_4_ * auVar232._16_4_;
    auVar244._20_4_ = fVar249 * auVar117._20_4_ + auVar256._20_4_ * auVar232._20_4_;
    auVar244._24_4_ = fVar250 * auVar117._24_4_ + auVar256._24_4_ * auVar232._24_4_;
    auVar244._28_4_ = auVar19._28_4_ + auVar256._28_4_;
    auVar23 = vsubps_avx(auVar192,auVar90);
    auVar21 = vsubps_avx(auVar232,auVar117);
    local_2a0 = local_680 * auVar23._0_4_ * 3.0;
    fStack_29c = fStack_67c * auVar23._4_4_ * 3.0;
    auVar19._4_4_ = fStack_29c;
    auVar19._0_4_ = local_2a0;
    fStack_298 = fStack_678 * auVar23._8_4_ * 3.0;
    auVar19._8_4_ = fStack_298;
    fStack_294 = fStack_674 * auVar23._12_4_ * 3.0;
    auVar19._12_4_ = fStack_294;
    fStack_290 = local_680 * auVar23._16_4_ * 3.0;
    auVar19._16_4_ = fStack_290;
    fStack_28c = fStack_67c * auVar23._20_4_ * 3.0;
    auVar19._20_4_ = fStack_28c;
    fStack_288 = fStack_678 * auVar23._24_4_ * 3.0;
    auVar19._24_4_ = fStack_288;
    auVar19._28_4_ = auVar23._28_4_;
    local_2c0 = local_680 * auVar21._0_4_ * 3.0;
    fStack_2bc = fStack_67c * auVar21._4_4_ * 3.0;
    auVar24._4_4_ = fStack_2bc;
    auVar24._0_4_ = local_2c0;
    fStack_2b8 = fStack_678 * auVar21._8_4_ * 3.0;
    auVar24._8_4_ = fStack_2b8;
    fStack_2b4 = fStack_674 * auVar21._12_4_ * 3.0;
    auVar24._12_4_ = fStack_2b4;
    fStack_2b0 = local_680 * auVar21._16_4_ * 3.0;
    auVar24._16_4_ = fStack_2b0;
    fStack_2ac = fStack_67c * auVar21._20_4_ * 3.0;
    auVar24._20_4_ = fStack_2ac;
    fStack_2a8 = fStack_678 * auVar21._24_4_ * 3.0;
    auVar24._24_4_ = fStack_2a8;
    auVar24._28_4_ = auVar192._28_4_;
    auVar21 = vperm2f128_avx(auVar224,auVar224,1);
    auVar21 = vshufps_avx(auVar21,auVar224,0x30);
    auVar88 = vshufps_avx(auVar224,auVar21,0x29);
    auVar19 = vsubps_avx(auVar224,auVar19);
    auVar21 = vperm2f128_avx(auVar19,auVar19,1);
    auVar21 = vshufps_avx(auVar21,auVar19,0x30);
    auVar21 = vshufps_avx(auVar19,auVar21,0x29);
    auVar24 = vsubps_avx(auVar244,auVar24);
    auVar19 = vperm2f128_avx(auVar24,auVar24,1);
    auVar19 = vshufps_avx(auVar19,auVar24,0x30);
    local_200 = vshufps_avx(auVar24,auVar19,0x29);
    auVar25 = vsubps_avx(auVar224,local_220);
    auVar89 = vsubps_avx(auVar88,_local_520);
    fVar147 = auVar89._0_4_ + auVar25._0_4_;
    fVar193 = auVar89._4_4_ + auVar25._4_4_;
    fVar157 = auVar89._8_4_ + auVar25._8_4_;
    fVar194 = auVar89._12_4_ + auVar25._12_4_;
    fVar158 = auVar89._16_4_ + auVar25._16_4_;
    fVar195 = auVar89._20_4_ + auVar25._20_4_;
    fVar159 = auVar89._24_4_ + auVar25._24_4_;
    auVar19 = vperm2f128_avx(auVar156,auVar156,1);
    auVar19 = vshufps_avx(auVar19,auVar156,0x30);
    local_240 = vshufps_avx(auVar156,auVar19,0x29);
    auVar19 = vperm2f128_avx(auVar244,auVar244,1);
    auVar19 = vshufps_avx(auVar19,auVar244,0x30);
    auVar24 = vshufps_avx(auVar244,auVar19,0x29);
    auVar19 = vsubps_avx(auVar244,auVar156);
    auVar90 = vsubps_avx(auVar24,local_240);
    fVar196 = auVar90._0_4_ + auVar19._0_4_;
    fVar210 = auVar90._4_4_ + auVar19._4_4_;
    fVar211 = auVar90._8_4_ + auVar19._8_4_;
    fVar212 = auVar90._12_4_ + auVar19._12_4_;
    fVar260 = auVar90._16_4_ + auVar19._16_4_;
    fVar269 = auVar90._20_4_ + auVar19._20_4_;
    fVar270 = auVar90._24_4_ + auVar19._24_4_;
    auVar26._4_4_ = fVar193 * auVar156._4_4_;
    auVar26._0_4_ = fVar147 * auVar156._0_4_;
    auVar26._8_4_ = fVar157 * auVar156._8_4_;
    auVar26._12_4_ = fVar194 * auVar156._12_4_;
    auVar26._16_4_ = fVar158 * auVar156._16_4_;
    auVar26._20_4_ = fVar195 * auVar156._20_4_;
    auVar26._24_4_ = fVar159 * auVar156._24_4_;
    auVar26._28_4_ = auVar19._28_4_;
    auVar27._4_4_ = fVar210 * local_220._4_4_;
    auVar27._0_4_ = fVar196 * local_220._0_4_;
    auVar27._8_4_ = fVar211 * local_220._8_4_;
    auVar27._12_4_ = fVar212 * local_220._12_4_;
    auVar27._16_4_ = fVar260 * local_220._16_4_;
    auVar27._20_4_ = fVar269 * local_220._20_4_;
    auVar27._24_4_ = fVar270 * local_220._24_4_;
    auVar27._28_4_ = fVar281;
    auVar26 = vsubps_avx(auVar26,auVar27);
    local_260 = local_220._0_4_ + local_260;
    fStack_25c = local_220._4_4_ + fStack_25c;
    fStack_258 = local_220._8_4_ + fStack_258;
    fStack_254 = local_220._12_4_ + fStack_254;
    fStack_250 = local_220._16_4_ + fStack_250;
    fStack_24c = local_220._20_4_ + fStack_24c;
    fStack_248 = local_220._24_4_ + fStack_248;
    fStack_244 = local_220._28_4_ + auVar20._28_4_;
    local_280 = local_280 + auVar156._0_4_;
    fStack_27c = fStack_27c + auVar156._4_4_;
    fStack_278 = fStack_278 + auVar156._8_4_;
    fStack_274 = fStack_274 + auVar156._12_4_;
    fStack_270 = fStack_270 + auVar156._16_4_;
    fStack_26c = fStack_26c + auVar156._20_4_;
    fStack_268 = fStack_268 + auVar156._24_4_;
    fStack_264 = fVar284 + auVar156._28_4_;
    auVar20._4_4_ = fVar193 * fStack_27c;
    auVar20._0_4_ = fVar147 * local_280;
    auVar20._8_4_ = fVar157 * fStack_278;
    auVar20._12_4_ = fVar194 * fStack_274;
    auVar20._16_4_ = fVar158 * fStack_270;
    auVar20._20_4_ = fVar195 * fStack_26c;
    auVar20._24_4_ = fVar159 * fStack_268;
    auVar20._28_4_ = fVar284;
    auVar28._4_4_ = fVar210 * fStack_25c;
    auVar28._0_4_ = fVar196 * local_260;
    auVar28._8_4_ = fVar211 * fStack_258;
    auVar28._12_4_ = fVar212 * fStack_254;
    auVar28._16_4_ = fVar260 * fStack_250;
    auVar28._20_4_ = fVar269 * fStack_24c;
    auVar28._24_4_ = fVar270 * fStack_248;
    auVar28._28_4_ = fVar284 + auVar156._28_4_;
    auVar20 = vsubps_avx(auVar20,auVar28);
    local_6a0 = auVar22._0_4_;
    fStack_69c = auVar22._4_4_;
    fStack_698 = auVar22._8_4_;
    fStack_694 = auVar22._12_4_;
    fStack_690 = auVar22._16_4_;
    fStack_68c = auVar22._20_4_;
    fStack_688 = auVar22._24_4_;
    auVar29._4_4_ = fVar193 * fStack_69c;
    auVar29._0_4_ = fVar147 * local_6a0;
    auVar29._8_4_ = fVar157 * fStack_698;
    auVar29._12_4_ = fVar194 * fStack_694;
    auVar29._16_4_ = fVar158 * fStack_690;
    auVar29._20_4_ = fVar195 * fStack_68c;
    auVar29._24_4_ = fVar159 * fStack_688;
    auVar29._28_4_ = fVar284;
    local_700._0_4_ = auVar87._0_4_;
    local_700._4_4_ = auVar87._4_4_;
    fStack_6f8 = auVar87._8_4_;
    fStack_6f4 = auVar87._12_4_;
    fStack_6f0 = auVar87._16_4_;
    fStack_6ec = auVar87._20_4_;
    fStack_6e8 = auVar87._24_4_;
    auVar30._4_4_ = fVar210 * (float)local_700._4_4_;
    auVar30._0_4_ = fVar196 * (float)local_700._0_4_;
    auVar30._8_4_ = fVar211 * fStack_6f8;
    auVar30._12_4_ = fVar212 * fStack_6f4;
    auVar30._16_4_ = fVar260 * fStack_6f0;
    auVar30._20_4_ = fVar269 * fStack_6ec;
    auVar30._24_4_ = fVar270 * fStack_6e8;
    auVar30._28_4_ = local_220._28_4_;
    auVar27 = vsubps_avx(auVar29,auVar30);
    auVar31._4_4_ = local_240._4_4_ * fVar193;
    auVar31._0_4_ = local_240._0_4_ * fVar147;
    auVar31._8_4_ = local_240._8_4_ * fVar157;
    auVar31._12_4_ = local_240._12_4_ * fVar194;
    auVar31._16_4_ = local_240._16_4_ * fVar158;
    auVar31._20_4_ = local_240._20_4_ * fVar195;
    auVar31._24_4_ = local_240._24_4_ * fVar159;
    auVar31._28_4_ = fVar284;
    auVar32._4_4_ = local_520._4_4_ * fVar210;
    auVar32._0_4_ = local_520._0_4_ * fVar196;
    auVar32._8_4_ = local_520._8_4_ * fVar211;
    auVar32._12_4_ = local_520._12_4_ * fVar212;
    auVar32._16_4_ = local_520._16_4_ * fVar260;
    auVar32._20_4_ = local_520._20_4_ * fVar269;
    auVar32._24_4_ = local_520._24_4_ * fVar270;
    auVar32._28_4_ = local_240._28_4_;
    local_680 = auVar21._0_4_;
    fStack_67c = auVar21._4_4_;
    fStack_678 = auVar21._8_4_;
    fStack_674 = auVar21._12_4_;
    fStack_670 = auVar21._16_4_;
    fStack_66c = auVar21._20_4_;
    fStack_668 = auVar21._24_4_;
    auVar28 = vsubps_avx(auVar31,auVar32);
    auVar33._4_4_ = auVar244._4_4_ * fVar193;
    auVar33._0_4_ = auVar244._0_4_ * fVar147;
    auVar33._8_4_ = auVar244._8_4_ * fVar157;
    auVar33._12_4_ = auVar244._12_4_ * fVar194;
    auVar33._16_4_ = auVar244._16_4_ * fVar158;
    auVar33._20_4_ = auVar244._20_4_ * fVar195;
    auVar33._24_4_ = auVar244._24_4_ * fVar159;
    auVar33._28_4_ = fVar284;
    auVar34._4_4_ = fVar210 * auVar224._4_4_;
    auVar34._0_4_ = fVar196 * auVar224._0_4_;
    auVar34._8_4_ = fVar211 * auVar224._8_4_;
    auVar34._12_4_ = fVar212 * auVar224._12_4_;
    auVar34._16_4_ = fVar260 * auVar224._16_4_;
    auVar34._20_4_ = fVar269 * auVar224._20_4_;
    auVar34._24_4_ = fVar270 * auVar224._24_4_;
    auVar34._28_4_ = fStack_244;
    auVar29 = vsubps_avx(auVar33,auVar34);
    local_2a0 = auVar224._0_4_ + local_2a0;
    fStack_29c = auVar224._4_4_ + fStack_29c;
    fStack_298 = auVar224._8_4_ + fStack_298;
    fStack_294 = auVar224._12_4_ + fStack_294;
    fStack_290 = auVar224._16_4_ + fStack_290;
    fStack_28c = auVar224._20_4_ + fStack_28c;
    fStack_288 = auVar224._24_4_ + fStack_288;
    fStack_284 = auVar224._28_4_ + auVar23._28_4_;
    local_2c0 = auVar244._0_4_ + local_2c0;
    fStack_2bc = auVar244._4_4_ + fStack_2bc;
    fStack_2b8 = auVar244._8_4_ + fStack_2b8;
    fStack_2b4 = auVar244._12_4_ + fStack_2b4;
    fStack_2b0 = auVar244._16_4_ + fStack_2b0;
    fStack_2ac = auVar244._20_4_ + fStack_2ac;
    fStack_2a8 = auVar244._24_4_ + fStack_2a8;
    fStack_2a4 = auVar244._28_4_ + auVar192._28_4_;
    auVar23._4_4_ = fVar193 * fStack_2bc;
    auVar23._0_4_ = fVar147 * local_2c0;
    auVar23._8_4_ = fVar157 * fStack_2b8;
    auVar23._12_4_ = fVar194 * fStack_2b4;
    auVar23._16_4_ = fVar158 * fStack_2b0;
    auVar23._20_4_ = fVar195 * fStack_2ac;
    auVar23._24_4_ = fVar159 * fStack_2a8;
    auVar23._28_4_ = auVar244._28_4_ + auVar192._28_4_;
    auVar35._4_4_ = fStack_29c * fVar210;
    auVar35._0_4_ = local_2a0 * fVar196;
    auVar35._8_4_ = fStack_298 * fVar211;
    auVar35._12_4_ = fStack_294 * fVar212;
    auVar35._16_4_ = fStack_290 * fVar260;
    auVar35._20_4_ = fStack_28c * fVar269;
    auVar35._24_4_ = fStack_288 * fVar270;
    auVar35._28_4_ = fStack_284;
    auVar23 = vsubps_avx(auVar23,auVar35);
    auVar36._4_4_ = fVar193 * local_200._4_4_;
    auVar36._0_4_ = fVar147 * local_200._0_4_;
    auVar36._8_4_ = fVar157 * local_200._8_4_;
    auVar36._12_4_ = fVar194 * local_200._12_4_;
    auVar36._16_4_ = fVar158 * local_200._16_4_;
    auVar36._20_4_ = fVar195 * local_200._20_4_;
    auVar36._24_4_ = fVar159 * local_200._24_4_;
    auVar36._28_4_ = fStack_284;
    auVar37._4_4_ = fVar210 * fStack_67c;
    auVar37._0_4_ = fVar196 * local_680;
    auVar37._8_4_ = fVar211 * fStack_678;
    auVar37._12_4_ = fVar212 * fStack_674;
    auVar37._16_4_ = fVar260 * fStack_670;
    auVar37._20_4_ = fVar269 * fStack_66c;
    auVar37._24_4_ = fVar270 * fStack_668;
    auVar37._28_4_ = local_200._28_4_;
    auVar30 = vsubps_avx(auVar36,auVar37);
    auVar38._4_4_ = fVar193 * auVar24._4_4_;
    auVar38._0_4_ = fVar147 * auVar24._0_4_;
    auVar38._8_4_ = fVar157 * auVar24._8_4_;
    auVar38._12_4_ = fVar194 * auVar24._12_4_;
    auVar38._16_4_ = fVar158 * auVar24._16_4_;
    auVar38._20_4_ = fVar195 * auVar24._20_4_;
    auVar38._24_4_ = fVar159 * auVar24._24_4_;
    auVar38._28_4_ = auVar89._28_4_ + auVar25._28_4_;
    auVar25._4_4_ = auVar88._4_4_ * fVar210;
    auVar25._0_4_ = auVar88._0_4_ * fVar196;
    auVar25._8_4_ = auVar88._8_4_ * fVar211;
    auVar25._12_4_ = auVar88._12_4_ * fVar212;
    auVar25._16_4_ = auVar88._16_4_ * fVar260;
    auVar25._20_4_ = auVar88._20_4_ * fVar269;
    auVar25._24_4_ = auVar88._24_4_ * fVar270;
    auVar25._28_4_ = auVar90._28_4_ + auVar19._28_4_;
    auVar25 = vsubps_avx(auVar38,auVar25);
    auVar21 = vminps_avx(auVar26,auVar20);
    auVar87 = vmaxps_avx(auVar26,auVar20);
    auVar22 = vminps_avx(auVar27,auVar28);
    auVar22 = vminps_avx(auVar21,auVar22);
    auVar21 = vmaxps_avx(auVar27,auVar28);
    auVar87 = vmaxps_avx(auVar87,auVar21);
    auVar19 = vminps_avx(auVar29,auVar23);
    auVar21 = vmaxps_avx(auVar29,auVar23);
    auVar20 = vminps_avx(auVar30,auVar25);
    auVar20 = vminps_avx(auVar19,auVar20);
    auVar20 = vminps_avx(auVar22,auVar20);
    auVar22 = vmaxps_avx(auVar30,auVar25);
    auVar21 = vmaxps_avx(auVar21,auVar22);
    auVar21 = vmaxps_avx(auVar87,auVar21);
    auVar87 = vcmpps_avx(auVar20,local_1c0,2);
    auVar21 = vcmpps_avx(auVar21,local_1e0,5);
    auVar87 = vandps_avx(auVar21,auVar87);
    auVar21 = local_2e0 & auVar87;
    if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar21 >> 0x7f,0) != '\0') ||
          (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar21 >> 0xbf,0) != '\0') ||
        (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar21[0x1f] < '\0')
    {
      auVar21 = vsubps_avx(_local_520,local_220);
      auVar22 = vsubps_avx(auVar88,auVar224);
      fVar193 = auVar21._0_4_ + auVar22._0_4_;
      fVar157 = auVar21._4_4_ + auVar22._4_4_;
      fVar194 = auVar21._8_4_ + auVar22._8_4_;
      fVar158 = auVar21._12_4_ + auVar22._12_4_;
      fVar195 = auVar21._16_4_ + auVar22._16_4_;
      fVar159 = auVar21._20_4_ + auVar22._20_4_;
      fVar196 = auVar21._24_4_ + auVar22._24_4_;
      auVar20 = vsubps_avx(local_240,auVar156);
      auVar23 = vsubps_avx(auVar24,auVar244);
      fVar210 = auVar20._0_4_ + auVar23._0_4_;
      fVar211 = auVar20._4_4_ + auVar23._4_4_;
      fVar212 = auVar20._8_4_ + auVar23._8_4_;
      fVar260 = auVar20._12_4_ + auVar23._12_4_;
      fVar269 = auVar20._16_4_ + auVar23._16_4_;
      fVar270 = auVar20._20_4_ + auVar23._20_4_;
      fVar271 = auVar20._24_4_ + auVar23._24_4_;
      fVar147 = auVar23._28_4_;
      auVar39._4_4_ = auVar156._4_4_ * fVar157;
      auVar39._0_4_ = auVar156._0_4_ * fVar193;
      auVar39._8_4_ = auVar156._8_4_ * fVar194;
      auVar39._12_4_ = auVar156._12_4_ * fVar158;
      auVar39._16_4_ = auVar156._16_4_ * fVar195;
      auVar39._20_4_ = auVar156._20_4_ * fVar159;
      auVar39._24_4_ = auVar156._24_4_ * fVar196;
      auVar39._28_4_ = auVar156._28_4_;
      auVar40._4_4_ = local_220._4_4_ * fVar211;
      auVar40._0_4_ = local_220._0_4_ * fVar210;
      auVar40._8_4_ = local_220._8_4_ * fVar212;
      auVar40._12_4_ = local_220._12_4_ * fVar260;
      auVar40._16_4_ = local_220._16_4_ * fVar269;
      auVar40._20_4_ = local_220._20_4_ * fVar270;
      auVar40._24_4_ = local_220._24_4_ * fVar271;
      auVar40._28_4_ = local_220._28_4_;
      auVar23 = vsubps_avx(auVar39,auVar40);
      auVar41._4_4_ = fVar157 * fStack_27c;
      auVar41._0_4_ = fVar193 * local_280;
      auVar41._8_4_ = fVar194 * fStack_278;
      auVar41._12_4_ = fVar158 * fStack_274;
      auVar41._16_4_ = fVar195 * fStack_270;
      auVar41._20_4_ = fVar159 * fStack_26c;
      auVar41._24_4_ = fVar196 * fStack_268;
      auVar41._28_4_ = auVar156._28_4_;
      auVar42._4_4_ = fVar211 * fStack_25c;
      auVar42._0_4_ = fVar210 * local_260;
      auVar42._8_4_ = fVar212 * fStack_258;
      auVar42._12_4_ = fVar260 * fStack_254;
      auVar42._16_4_ = fVar269 * fStack_250;
      auVar42._20_4_ = fVar270 * fStack_24c;
      auVar42._24_4_ = fVar271 * fStack_248;
      auVar42._28_4_ = fVar147;
      auVar25 = vsubps_avx(auVar41,auVar42);
      auVar43._4_4_ = fVar157 * fStack_69c;
      auVar43._0_4_ = fVar193 * local_6a0;
      auVar43._8_4_ = fVar194 * fStack_698;
      auVar43._12_4_ = fVar158 * fStack_694;
      auVar43._16_4_ = fVar195 * fStack_690;
      auVar43._20_4_ = fVar159 * fStack_68c;
      auVar43._24_4_ = fVar196 * fStack_688;
      auVar43._28_4_ = fVar147;
      auVar44._4_4_ = fVar211 * (float)local_700._4_4_;
      auVar44._0_4_ = fVar210 * (float)local_700._0_4_;
      auVar44._8_4_ = fVar212 * fStack_6f8;
      auVar44._12_4_ = fVar260 * fStack_6f4;
      auVar44._16_4_ = fVar269 * fStack_6f0;
      auVar44._20_4_ = fVar270 * fStack_6ec;
      auVar44._24_4_ = fVar271 * fStack_6e8;
      auVar44._28_4_ = auVar19._28_4_;
      auVar89 = vsubps_avx(auVar43,auVar44);
      auVar45._4_4_ = local_240._4_4_ * fVar157;
      auVar45._0_4_ = local_240._0_4_ * fVar193;
      auVar45._8_4_ = local_240._8_4_ * fVar194;
      auVar45._12_4_ = local_240._12_4_ * fVar158;
      auVar45._16_4_ = local_240._16_4_ * fVar195;
      auVar45._20_4_ = local_240._20_4_ * fVar159;
      auVar45._24_4_ = local_240._24_4_ * fVar196;
      auVar45._28_4_ = auVar19._28_4_;
      auVar46._4_4_ = local_520._4_4_ * fVar211;
      auVar46._0_4_ = local_520._0_4_ * fVar210;
      auVar46._8_4_ = local_520._8_4_ * fVar212;
      auVar46._12_4_ = local_520._12_4_ * fVar260;
      auVar46._16_4_ = local_520._16_4_ * fVar269;
      auVar46._20_4_ = local_520._20_4_ * fVar270;
      uVar6 = local_520._28_4_;
      auVar46._24_4_ = local_520._24_4_ * fVar271;
      auVar46._28_4_ = uVar6;
      auVar90 = vsubps_avx(auVar45,auVar46);
      auVar47._4_4_ = auVar244._4_4_ * fVar157;
      auVar47._0_4_ = auVar244._0_4_ * fVar193;
      auVar47._8_4_ = auVar244._8_4_ * fVar194;
      auVar47._12_4_ = auVar244._12_4_ * fVar158;
      auVar47._16_4_ = auVar244._16_4_ * fVar195;
      auVar47._20_4_ = auVar244._20_4_ * fVar159;
      auVar47._24_4_ = auVar244._24_4_ * fVar196;
      auVar47._28_4_ = uVar6;
      auVar48._4_4_ = auVar224._4_4_ * fVar211;
      auVar48._0_4_ = auVar224._0_4_ * fVar210;
      auVar48._8_4_ = auVar224._8_4_ * fVar212;
      auVar48._12_4_ = auVar224._12_4_ * fVar260;
      auVar48._16_4_ = auVar224._16_4_ * fVar269;
      auVar48._20_4_ = auVar224._20_4_ * fVar270;
      auVar48._24_4_ = auVar224._24_4_ * fVar271;
      auVar48._28_4_ = auVar224._28_4_;
      auVar26 = vsubps_avx(auVar47,auVar48);
      auVar49._4_4_ = fVar157 * fStack_2bc;
      auVar49._0_4_ = fVar193 * local_2c0;
      auVar49._8_4_ = fVar194 * fStack_2b8;
      auVar49._12_4_ = fVar158 * fStack_2b4;
      auVar49._16_4_ = fVar195 * fStack_2b0;
      auVar49._20_4_ = fVar159 * fStack_2ac;
      auVar49._24_4_ = fVar196 * fStack_2a8;
      auVar49._28_4_ = uVar6;
      auVar50._4_4_ = fVar211 * fStack_29c;
      auVar50._0_4_ = fVar210 * local_2a0;
      auVar50._8_4_ = fVar212 * fStack_298;
      auVar50._12_4_ = fVar260 * fStack_294;
      auVar50._16_4_ = fVar269 * fStack_290;
      auVar50._20_4_ = fVar270 * fStack_28c;
      auVar50._24_4_ = fVar271 * fStack_288;
      auVar50._28_4_ = auVar244._28_4_;
      auVar27 = vsubps_avx(auVar49,auVar50);
      auVar51._4_4_ = fVar157 * local_200._4_4_;
      auVar51._0_4_ = fVar193 * local_200._0_4_;
      auVar51._8_4_ = fVar194 * local_200._8_4_;
      auVar51._12_4_ = fVar158 * local_200._12_4_;
      auVar51._16_4_ = fVar195 * local_200._16_4_;
      auVar51._20_4_ = fVar159 * local_200._20_4_;
      auVar51._24_4_ = fVar196 * local_200._24_4_;
      auVar51._28_4_ = auVar244._28_4_;
      auVar52._4_4_ = fStack_67c * fVar211;
      auVar52._0_4_ = local_680 * fVar210;
      auVar52._8_4_ = fStack_678 * fVar212;
      auVar52._12_4_ = fStack_674 * fVar260;
      auVar52._16_4_ = fStack_670 * fVar269;
      auVar52._20_4_ = fStack_66c * fVar270;
      auVar52._24_4_ = fStack_668 * fVar271;
      auVar52._28_4_ = local_240._28_4_;
      auVar28 = vsubps_avx(auVar51,auVar52);
      auVar53._4_4_ = fVar157 * auVar24._4_4_;
      auVar53._0_4_ = fVar193 * auVar24._0_4_;
      auVar53._8_4_ = fVar194 * auVar24._8_4_;
      auVar53._12_4_ = fVar158 * auVar24._12_4_;
      auVar53._16_4_ = fVar195 * auVar24._16_4_;
      auVar53._20_4_ = fVar159 * auVar24._20_4_;
      auVar53._24_4_ = fVar196 * auVar24._24_4_;
      auVar53._28_4_ = auVar21._28_4_ + auVar22._28_4_;
      auVar54._4_4_ = auVar88._4_4_ * fVar211;
      auVar54._0_4_ = auVar88._0_4_ * fVar210;
      auVar54._8_4_ = auVar88._8_4_ * fVar212;
      auVar54._12_4_ = auVar88._12_4_ * fVar260;
      auVar54._16_4_ = auVar88._16_4_ * fVar269;
      auVar54._20_4_ = auVar88._20_4_ * fVar270;
      auVar54._24_4_ = auVar88._24_4_ * fVar271;
      auVar54._28_4_ = auVar20._28_4_ + fVar147;
      auVar24 = vsubps_avx(auVar53,auVar54);
      auVar22 = vminps_avx(auVar23,auVar25);
      auVar21 = vmaxps_avx(auVar23,auVar25);
      auVar19 = vminps_avx(auVar89,auVar90);
      auVar19 = vminps_avx(auVar22,auVar19);
      auVar22 = vmaxps_avx(auVar89,auVar90);
      auVar21 = vmaxps_avx(auVar21,auVar22);
      auVar20 = vminps_avx(auVar26,auVar27);
      auVar22 = vmaxps_avx(auVar26,auVar27);
      auVar88 = vminps_avx(auVar28,auVar24);
      auVar20 = vminps_avx(auVar20,auVar88);
      auVar20 = vminps_avx(auVar19,auVar20);
      auVar19 = vmaxps_avx(auVar28,auVar24);
      auVar22 = vmaxps_avx(auVar22,auVar19);
      auVar22 = vmaxps_avx(auVar21,auVar22);
      auVar21 = vcmpps_avx(auVar20,local_1c0,2);
      auVar22 = vcmpps_avx(auVar22,local_1e0,5);
      auVar21 = vandps_avx(auVar22,auVar21);
      auVar87 = vandps_avx(local_2e0,auVar87);
      auVar22 = auVar87 & auVar21;
      if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar22 >> 0x7f,0) != '\0') ||
            (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar22 >> 0xbf,0) != '\0') ||
          (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar22[0x1f] < '\0') {
        auVar87 = vandps_avx(auVar21,auVar87);
        uVar60 = vmovmskps_avx(auVar87);
        if (uVar60 != 0) {
          auStack_490[uVar65] = uVar60 & 0xff;
          uVar7 = vmovlps_avx(local_420);
          *(undefined8 *)(afStack_340 + uVar65 * 2) = uVar7;
          uVar8 = vmovlps_avx(auVar122);
          auStack_1a0[uVar65] = uVar8;
          uVar65 = (ulong)((int)uVar65 + 1);
        }
      }
    }
LAB_007a4c98:
    do {
      do {
        do {
          do {
            if ((int)uVar65 == 0) {
              uVar6 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar86._4_4_ = uVar6;
              auVar86._0_4_ = uVar6;
              auVar86._8_4_ = uVar6;
              auVar86._12_4_ = uVar6;
              auVar75 = vcmpps_avx(local_480,auVar86,2);
              uVar59 = vmovmskps_avx(auVar75);
              uVar59 = (uint)uVar66 & uVar59;
              goto LAB_007a3df2;
            }
            uVar62 = (int)uVar65 - 1;
            uVar63 = (ulong)uVar62;
            uVar60 = auStack_490[uVar63];
            fVar147 = afStack_340[uVar63 * 2];
            fVar193 = afStack_340[uVar63 * 2 + 1];
            auVar296._8_8_ = 0;
            auVar296._0_8_ = auStack_1a0[uVar63];
            auVar300 = ZEXT1664(auVar296);
            uVar8 = 0;
            if (uVar60 != 0) {
              for (; (uVar60 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
              }
            }
            uVar60 = uVar60 - 1 & uVar60;
            auStack_490[uVar63] = uVar60;
            if (uVar60 == 0) {
              uVar65 = (ulong)uVar62;
            }
            fVar194 = (float)(uVar8 + 1) * 0.14285715;
            fVar157 = (1.0 - (float)uVar8 * 0.14285715) * fVar147 +
                      fVar193 * (float)uVar8 * 0.14285715;
            fVar147 = (1.0 - fVar194) * fVar147 + fVar193 * fVar194;
            fVar193 = fVar147 - fVar157;
            if (0.16666667 <= fVar193) {
              auVar75 = vinsertps_avx(ZEXT416((uint)fVar157),ZEXT416((uint)fVar147),0x10);
              auVar306 = ZEXT1664(auVar75);
              goto LAB_007a462b;
            }
            auVar75 = vshufps_avx(auVar296,auVar296,0x50);
            auVar102._8_4_ = 0x3f800000;
            auVar102._0_8_ = 0x3f8000003f800000;
            auVar102._12_4_ = 0x3f800000;
            auVar263 = vsubps_avx(auVar102,auVar75);
            fVar194 = auVar75._0_4_;
            fVar158 = auVar75._4_4_;
            fVar195 = auVar75._8_4_;
            fVar159 = auVar75._12_4_;
            fVar196 = auVar263._0_4_;
            fVar210 = auVar263._4_4_;
            fVar211 = auVar263._8_4_;
            fVar212 = auVar263._12_4_;
            auVar127._0_4_ = auVar274._0_4_ * fVar194 + fVar196 * fVar251;
            auVar127._4_4_ = auVar274._4_4_ * fVar158 + fVar210 * fVar258;
            auVar127._8_4_ = auVar274._0_4_ * fVar195 + fVar211 * fVar251;
            auVar127._12_4_ = auVar274._4_4_ * fVar159 + fVar212 * fVar258;
            auVar165._0_4_ = auVar228._0_4_ * fVar194 + fVar196 * fVar257;
            auVar165._4_4_ = auVar228._4_4_ * fVar158 + fVar210 * fVar259;
            auVar165._8_4_ = auVar228._0_4_ * fVar195 + fVar211 * fVar257;
            auVar165._12_4_ = auVar228._4_4_ * fVar159 + fVar212 * fVar259;
            auVar185._0_4_ = auVar101._0_4_ * fVar194 + auVar294._0_4_ * fVar196;
            auVar185._4_4_ = auVar101._4_4_ * fVar158 + auVar294._4_4_ * fVar210;
            auVar185._8_4_ = auVar101._0_4_ * fVar195 + auVar294._0_4_ * fVar211;
            auVar185._12_4_ = auVar101._4_4_ * fVar159 + auVar294._4_4_ * fVar212;
            auVar72._0_4_ = auVar70._0_4_ * fVar194 + auVar287._0_4_ * fVar196;
            auVar72._4_4_ = auVar70._4_4_ * fVar158 + auVar287._4_4_ * fVar210;
            auVar72._8_4_ = auVar70._0_4_ * fVar195 + auVar287._0_4_ * fVar211;
            auVar72._12_4_ = auVar70._4_4_ * fVar159 + auVar287._4_4_ * fVar212;
            auVar118._16_16_ = auVar127;
            auVar118._0_16_ = auVar127;
            auVar144._16_16_ = auVar165;
            auVar144._0_16_ = auVar165;
            auVar176._16_16_ = auVar185;
            auVar176._0_16_ = auVar185;
            auVar87 = ZEXT2032(CONCAT416(fVar147,ZEXT416((uint)fVar157)));
            auVar87 = vshufps_avx(auVar87,auVar87,0);
            auVar21 = vsubps_avx(auVar144,auVar118);
            fVar194 = auVar87._0_4_;
            fVar158 = auVar87._4_4_;
            fVar195 = auVar87._8_4_;
            fVar159 = auVar87._12_4_;
            fVar196 = auVar87._16_4_;
            fVar210 = auVar87._20_4_;
            fVar211 = auVar87._24_4_;
            auVar119._0_4_ = auVar127._0_4_ + auVar21._0_4_ * fVar194;
            auVar119._4_4_ = auVar127._4_4_ + auVar21._4_4_ * fVar158;
            auVar119._8_4_ = auVar127._8_4_ + auVar21._8_4_ * fVar195;
            auVar119._12_4_ = auVar127._12_4_ + auVar21._12_4_ * fVar159;
            auVar119._16_4_ = auVar127._0_4_ + auVar21._16_4_ * fVar196;
            auVar119._20_4_ = auVar127._4_4_ + auVar21._20_4_ * fVar210;
            auVar119._24_4_ = auVar127._8_4_ + auVar21._24_4_ * fVar211;
            auVar119._28_4_ = auVar127._12_4_ + auVar21._28_4_;
            auVar87 = vsubps_avx(auVar176,auVar144);
            auVar145._0_4_ = auVar165._0_4_ + auVar87._0_4_ * fVar194;
            auVar145._4_4_ = auVar165._4_4_ + auVar87._4_4_ * fVar158;
            auVar145._8_4_ = auVar165._8_4_ + auVar87._8_4_ * fVar195;
            auVar145._12_4_ = auVar165._12_4_ + auVar87._12_4_ * fVar159;
            auVar145._16_4_ = auVar165._0_4_ + auVar87._16_4_ * fVar196;
            auVar145._20_4_ = auVar165._4_4_ + auVar87._20_4_ * fVar210;
            auVar145._24_4_ = auVar165._8_4_ + auVar87._24_4_ * fVar211;
            auVar145._28_4_ = auVar165._12_4_ + auVar87._28_4_;
            auVar75 = vsubps_avx(auVar72,auVar185);
            auVar91._0_4_ = auVar185._0_4_ + auVar75._0_4_ * fVar194;
            auVar91._4_4_ = auVar185._4_4_ + auVar75._4_4_ * fVar158;
            auVar91._8_4_ = auVar185._8_4_ + auVar75._8_4_ * fVar195;
            auVar91._12_4_ = auVar185._12_4_ + auVar75._12_4_ * fVar159;
            auVar91._16_4_ = auVar185._0_4_ + auVar75._0_4_ * fVar196;
            auVar91._20_4_ = auVar185._4_4_ + auVar75._4_4_ * fVar210;
            auVar91._24_4_ = auVar185._8_4_ + auVar75._8_4_ * fVar211;
            auVar91._28_4_ = auVar185._12_4_ + auVar75._12_4_;
            auVar87 = vsubps_avx(auVar145,auVar119);
            auVar120._0_4_ = auVar119._0_4_ + fVar194 * auVar87._0_4_;
            auVar120._4_4_ = auVar119._4_4_ + fVar158 * auVar87._4_4_;
            auVar120._8_4_ = auVar119._8_4_ + fVar195 * auVar87._8_4_;
            auVar120._12_4_ = auVar119._12_4_ + fVar159 * auVar87._12_4_;
            auVar120._16_4_ = auVar119._16_4_ + fVar196 * auVar87._16_4_;
            auVar120._20_4_ = auVar119._20_4_ + fVar210 * auVar87._20_4_;
            auVar120._24_4_ = auVar119._24_4_ + fVar211 * auVar87._24_4_;
            auVar120._28_4_ = auVar119._28_4_ + auVar87._28_4_;
            auVar87 = vsubps_avx(auVar91,auVar145);
            auVar92._0_4_ = auVar145._0_4_ + fVar194 * auVar87._0_4_;
            auVar92._4_4_ = auVar145._4_4_ + fVar158 * auVar87._4_4_;
            auVar92._8_4_ = auVar145._8_4_ + fVar195 * auVar87._8_4_;
            auVar92._12_4_ = auVar145._12_4_ + fVar159 * auVar87._12_4_;
            auVar92._16_4_ = auVar145._16_4_ + fVar196 * auVar87._16_4_;
            auVar92._20_4_ = auVar145._20_4_ + fVar210 * auVar87._20_4_;
            auVar92._24_4_ = auVar145._24_4_ + fVar211 * auVar87._24_4_;
            auVar92._28_4_ = auVar145._28_4_ + auVar87._28_4_;
            auVar87 = vsubps_avx(auVar92,auVar120);
            auVar204._0_4_ = auVar120._0_4_ + fVar194 * auVar87._0_4_;
            auVar204._4_4_ = auVar120._4_4_ + fVar158 * auVar87._4_4_;
            auVar204._8_4_ = auVar120._8_4_ + fVar195 * auVar87._8_4_;
            auVar204._12_4_ = auVar120._12_4_ + fVar159 * auVar87._12_4_;
            auVar209._16_4_ = auVar120._16_4_ + fVar196 * auVar87._16_4_;
            auVar209._0_16_ = auVar204;
            auVar209._20_4_ = auVar120._20_4_ + fVar210 * auVar87._20_4_;
            auVar209._24_4_ = auVar120._24_4_ + fVar211 * auVar87._24_4_;
            auVar209._28_4_ = auVar120._28_4_ + auVar145._28_4_;
            auVar99 = auVar209._16_16_;
            auVar104 = vshufps_avx(ZEXT416((uint)(fVar193 * 0.33333334)),
                                   ZEXT416((uint)(fVar193 * 0.33333334)),0);
            auVar166._0_4_ = auVar204._0_4_ + auVar104._0_4_ * auVar87._0_4_ * 3.0;
            auVar166._4_4_ = auVar204._4_4_ + auVar104._4_4_ * auVar87._4_4_ * 3.0;
            auVar166._8_4_ = auVar204._8_4_ + auVar104._8_4_ * auVar87._8_4_ * 3.0;
            auVar166._12_4_ = auVar204._12_4_ + auVar104._12_4_ * auVar87._12_4_ * 3.0;
            auVar143 = vshufpd_avx(auVar204,auVar204,3);
            auVar69 = vshufpd_avx(auVar99,auVar99,3);
            _local_520 = auVar143;
            auVar75 = vsubps_avx(auVar143,auVar204);
            auVar263 = vsubps_avx(auVar69,auVar99);
            auVar73._0_4_ = auVar75._0_4_ + auVar263._0_4_;
            auVar73._4_4_ = auVar75._4_4_ + auVar263._4_4_;
            auVar73._8_4_ = auVar75._8_4_ + auVar263._8_4_;
            auVar73._12_4_ = auVar75._12_4_ + auVar263._12_4_;
            auVar75 = vmovshdup_avx(auVar204);
            auVar263 = vmovshdup_avx(auVar166);
            auVar129 = vshufps_avx(auVar73,auVar73,0);
            auVar68 = vshufps_avx(auVar73,auVar73,0x55);
            fVar194 = auVar68._0_4_;
            fVar158 = auVar68._4_4_;
            fVar195 = auVar68._8_4_;
            fVar159 = auVar68._12_4_;
            fVar196 = auVar129._0_4_;
            fVar210 = auVar129._4_4_;
            fVar211 = auVar129._8_4_;
            fVar212 = auVar129._12_4_;
            auVar74._0_4_ = fVar196 * auVar204._0_4_ + auVar75._0_4_ * fVar194;
            auVar74._4_4_ = fVar210 * auVar204._4_4_ + auVar75._4_4_ * fVar158;
            auVar74._8_4_ = fVar211 * auVar204._8_4_ + auVar75._8_4_ * fVar195;
            auVar74._12_4_ = fVar212 * auVar204._12_4_ + auVar75._12_4_ * fVar159;
            auVar264._0_4_ = fVar196 * auVar166._0_4_ + auVar263._0_4_ * fVar194;
            auVar264._4_4_ = fVar210 * auVar166._4_4_ + auVar263._4_4_ * fVar158;
            auVar264._8_4_ = fVar211 * auVar166._8_4_ + auVar263._8_4_ * fVar195;
            auVar264._12_4_ = fVar212 * auVar166._12_4_ + auVar263._12_4_ * fVar159;
            auVar263 = vshufps_avx(auVar74,auVar74,0xe8);
            auVar129 = vshufps_avx(auVar264,auVar264,0xe8);
            auVar75 = vcmpps_avx(auVar263,auVar129,1);
            uVar60 = vextractps_avx(auVar75,0);
            auVar68 = auVar264;
            if ((uVar60 & 1) == 0) {
              auVar68 = auVar74;
            }
            auVar103._0_4_ = auVar104._0_4_ * auVar87._16_4_ * 3.0;
            auVar103._4_4_ = auVar104._4_4_ * auVar87._20_4_ * 3.0;
            auVar103._8_4_ = auVar104._8_4_ * auVar87._24_4_ * 3.0;
            auVar103._12_4_ = auVar104._12_4_ * 0.0;
            auVar98 = vsubps_avx(auVar99,auVar103);
            auVar104 = vmovshdup_avx(auVar98);
            auVar99 = vmovshdup_avx(auVar99);
            fVar260 = auVar98._0_4_;
            fVar269 = auVar98._4_4_;
            auVar186._0_4_ = fVar260 * fVar196 + auVar104._0_4_ * fVar194;
            auVar186._4_4_ = fVar269 * fVar210 + auVar104._4_4_ * fVar158;
            auVar186._8_4_ = auVar98._8_4_ * fVar211 + auVar104._8_4_ * fVar195;
            auVar186._12_4_ = auVar98._12_4_ * fVar212 + auVar104._12_4_ * fVar159;
            auVar305._0_4_ = fVar196 * auVar209._16_4_ + auVar99._0_4_ * fVar194;
            auVar305._4_4_ = fVar210 * auVar209._20_4_ + auVar99._4_4_ * fVar158;
            auVar305._8_4_ = fVar211 * auVar209._24_4_ + auVar99._8_4_ * fVar195;
            auVar305._12_4_ = fVar212 * auVar209._28_4_ + auVar99._12_4_ * fVar159;
            auVar99 = vshufps_avx(auVar186,auVar186,0xe8);
            auVar121 = vshufps_avx(auVar305,auVar305,0xe8);
            auVar104 = vcmpps_avx(auVar99,auVar121,1);
            uVar60 = vextractps_avx(auVar104,0);
            auVar122 = auVar305;
            if ((uVar60 & 1) == 0) {
              auVar122 = auVar186;
            }
            auVar68 = vmaxss_avx(auVar122,auVar68);
            auVar263 = vminps_avx(auVar263,auVar129);
            auVar129 = vminps_avx(auVar99,auVar121);
            auVar129 = vminps_avx(auVar263,auVar129);
            auVar75 = vshufps_avx(auVar75,auVar75,0x55);
            auVar75 = vblendps_avx(auVar75,auVar104,2);
            auVar104 = vpslld_avx(auVar75,0x1f);
            auVar75 = vshufpd_avx(auVar264,auVar264,1);
            auVar75 = vinsertps_avx(auVar75,auVar305,0x9c);
            auVar263 = vshufpd_avx(auVar74,auVar74,1);
            auVar263 = vinsertps_avx(auVar263,auVar186,0x9c);
            auVar75 = vblendvps_avx(auVar263,auVar75,auVar104);
            auVar263 = vmovshdup_avx(auVar75);
            auVar75 = vmaxss_avx(auVar263,auVar75);
            fVar195 = auVar129._0_4_;
            auVar263 = vmovshdup_avx(auVar129);
            fVar158 = auVar75._0_4_;
            fVar159 = auVar263._0_4_;
            fVar194 = auVar68._0_4_;
            if ((fVar195 < 0.0001) && (-0.0001 < fVar158)) break;
            if ((fVar159 < 0.0001 && -0.0001 < fVar194) || (fVar195 < 0.0001 && -0.0001 < fVar194))
            break;
            auVar104 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar75,1);
            auVar263 = vcmpps_avx(auVar263,SUB6416(ZEXT464(0x38d1b717),0),1);
            auVar263 = vandps_avx(auVar263,auVar104);
          } while ((auVar263 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
          auVar104 = vcmpps_avx(auVar129,_DAT_01f45a50,1);
          auVar263 = vcmpss_avx(auVar68,ZEXT416(0) << 0x20,1);
          auVar128._8_4_ = 0x3f800000;
          auVar128._0_8_ = 0x3f8000003f800000;
          auVar128._12_4_ = 0x3f800000;
          auVar167._8_4_ = 0xbf800000;
          auVar167._0_8_ = 0xbf800000bf800000;
          auVar167._12_4_ = 0xbf800000;
          auVar263 = vblendvps_avx(auVar128,auVar167,auVar263);
          auVar104 = vblendvps_avx(auVar128,auVar167,auVar104);
          auVar129 = vcmpss_avx(auVar104,auVar263,4);
          auVar129 = vpshufd_avx(ZEXT416(auVar129._0_4_ & 1),0x50);
          auVar129 = vpslld_avx(auVar129,0x1f);
          auVar129 = vpsrad_avx(auVar129,0x1f);
          auVar129 = vpandn_avx(auVar129,_DAT_01f7afb0);
          auVar68 = vmovshdup_avx(auVar104);
          fVar196 = auVar68._0_4_;
          if ((auVar104._0_4_ != fVar196) || (NAN(auVar104._0_4_) || NAN(fVar196))) {
            if ((fVar159 != fVar195) || (NAN(fVar159) || NAN(fVar195))) {
              fVar195 = -fVar195 / (fVar159 - fVar195);
              auVar104 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar195) * 0.0 + fVar195)));
            }
            else {
              auVar104 = ZEXT816(0x3f80000000000000);
              if ((fVar195 != 0.0) || (NAN(fVar195))) {
                auVar104 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar99 = vcmpps_avx(auVar129,auVar104,1);
            auVar68 = vblendps_avx(auVar129,auVar104,2);
            auVar104 = vblendps_avx(auVar104,auVar129,2);
            auVar129 = vblendvps_avx(auVar104,auVar68,auVar99);
          }
          auVar75 = vcmpss_avx(auVar75,ZEXT416(0) << 0x20,1);
          auVar130._8_4_ = 0x3f800000;
          auVar130._0_8_ = 0x3f8000003f800000;
          auVar130._12_4_ = 0x3f800000;
          auVar168._8_4_ = 0xbf800000;
          auVar168._0_8_ = 0xbf800000bf800000;
          auVar168._12_4_ = 0xbf800000;
          auVar75 = vblendvps_avx(auVar130,auVar168,auVar75);
          fVar195 = auVar75._0_4_;
          if ((auVar263._0_4_ != fVar195) || (NAN(auVar263._0_4_) || NAN(fVar195))) {
            if ((fVar158 != fVar194) || (NAN(fVar158) || NAN(fVar194))) {
              fVar194 = -fVar194 / (fVar158 - fVar194);
              auVar75 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar194) * 0.0 + fVar194)));
            }
            else {
              auVar75 = ZEXT816(0x3f80000000000000);
              if ((fVar194 != 0.0) || (NAN(fVar194))) {
                auVar75 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar104 = vcmpps_avx(auVar129,auVar75,1);
            auVar263 = vblendps_avx(auVar129,auVar75,2);
            auVar75 = vblendps_avx(auVar75,auVar129,2);
            auVar129 = vblendvps_avx(auVar75,auVar263,auVar104);
          }
          if ((fVar196 != fVar195) || (NAN(fVar196) || NAN(fVar195))) {
            auVar76._8_4_ = 0x3f800000;
            auVar76._0_8_ = 0x3f8000003f800000;
            auVar76._12_4_ = 0x3f800000;
            auVar75 = vcmpps_avx(auVar129,auVar76,1);
            auVar263 = vinsertps_avx(auVar129,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar131._4_12_ = auVar129._4_12_;
            auVar131._0_4_ = 0x3f800000;
            auVar129 = vblendvps_avx(auVar131,auVar263,auVar75);
          }
          auVar75 = vcmpps_avx(auVar129,_DAT_01f46740,1);
          auVar56._12_4_ = 0;
          auVar56._0_12_ = auVar129._4_12_;
          auVar263 = vinsertps_avx(auVar129,ZEXT416(0x3f800000),0x10);
          auVar75 = vblendvps_avx(auVar263,auVar56 << 0x20,auVar75);
          auVar263 = vmovshdup_avx(auVar75);
        } while (auVar263._0_4_ < auVar75._0_4_);
        auVar77._0_4_ = auVar75._0_4_ + -0.1;
        auVar77._4_4_ = auVar75._4_4_ + 0.1;
        auVar77._8_4_ = auVar75._8_4_ + 0.0;
        auVar77._12_4_ = auVar75._12_4_ + 0.0;
        auVar104 = vshufpd_avx(auVar166,auVar166,3);
        auVar205._8_8_ = 0x3f80000000000000;
        auVar205._0_8_ = 0x3f80000000000000;
        auVar75 = vcmpps_avx(auVar77,auVar205,1);
        auVar55._12_4_ = 0;
        auVar55._0_12_ = auVar77._4_12_;
        auVar263 = vinsertps_avx(auVar77,SUB6416(ZEXT464(0x3f800000),0),0x10);
        auVar75 = vblendvps_avx(auVar263,auVar55 << 0x20,auVar75);
        auVar263 = vshufpd_avx(auVar98,auVar98,3);
        auVar129 = vshufps_avx(auVar75,auVar75,0x50);
        auVar206._8_4_ = 0x3f800000;
        auVar206._0_8_ = 0x3f8000003f800000;
        auVar206._12_4_ = 0x3f800000;
        auVar68 = vsubps_avx(auVar206,auVar129);
        local_520._0_4_ = auVar143._0_4_;
        local_520._4_4_ = auVar143._4_4_;
        fStack_518 = auVar143._8_4_;
        fStack_514 = auVar143._12_4_;
        fVar194 = auVar129._0_4_;
        fVar158 = auVar129._4_4_;
        fVar195 = auVar129._8_4_;
        fVar159 = auVar129._12_4_;
        local_6c0 = auVar69._0_4_;
        fStack_6bc = auVar69._4_4_;
        fStack_6b8 = auVar69._8_4_;
        fStack_6b4 = auVar69._12_4_;
        fVar196 = auVar68._0_4_;
        fVar210 = auVar68._4_4_;
        fVar211 = auVar68._8_4_;
        fVar212 = auVar68._12_4_;
        auVar78._0_4_ = fVar194 * (float)local_520._0_4_ + fVar196 * auVar204._0_4_;
        auVar78._4_4_ = fVar158 * (float)local_520._4_4_ + fVar210 * auVar204._4_4_;
        auVar78._8_4_ = fVar195 * fStack_518 + fVar211 * auVar204._0_4_;
        auVar78._12_4_ = fVar159 * fStack_514 + fVar212 * auVar204._4_4_;
        auVar187._0_4_ = auVar104._0_4_ * fVar194 + fVar196 * auVar166._0_4_;
        auVar187._4_4_ = auVar104._4_4_ * fVar158 + fVar210 * auVar166._4_4_;
        auVar187._8_4_ = auVar104._8_4_ * fVar195 + fVar211 * auVar166._0_4_;
        auVar187._12_4_ = auVar104._12_4_ * fVar159 + fVar212 * auVar166._4_4_;
        auVar222._0_4_ = auVar263._0_4_ * fVar194 + fVar196 * fVar260;
        auVar222._4_4_ = auVar263._4_4_ * fVar158 + fVar210 * fVar269;
        auVar222._8_4_ = auVar263._8_4_ * fVar195 + fVar211 * fVar260;
        auVar222._12_4_ = auVar263._12_4_ * fVar159 + fVar212 * fVar269;
        auVar253._0_4_ = fVar194 * local_6c0 + fVar196 * auVar209._16_4_;
        auVar253._4_4_ = fVar158 * fStack_6bc + fVar210 * auVar209._20_4_;
        auVar253._8_4_ = fVar195 * fStack_6b8 + fVar211 * auVar209._16_4_;
        auVar253._12_4_ = fVar159 * fStack_6b4 + fVar212 * auVar209._20_4_;
        auVar69 = vsubps_avx(auVar206,auVar75);
        auVar263 = vmovshdup_avx(auVar296);
        auVar143 = vmovsldup_avx(auVar296);
        auVar207._0_4_ = auVar69._0_4_ * auVar143._0_4_ + auVar75._0_4_ * auVar263._0_4_;
        auVar207._4_4_ = auVar69._4_4_ * auVar143._4_4_ + auVar75._4_4_ * auVar263._4_4_;
        auVar207._8_4_ = auVar69._8_4_ * auVar143._8_4_ + auVar75._8_4_ * auVar263._8_4_;
        auVar207._12_4_ = auVar69._12_4_ * auVar143._12_4_ + auVar75._12_4_ * auVar263._12_4_;
        auVar98 = vmovshdup_avx(auVar207);
        auVar75 = vsubps_avx(auVar187,auVar78);
        auVar132._0_4_ = auVar75._0_4_ * 3.0;
        auVar132._4_4_ = auVar75._4_4_ * 3.0;
        auVar132._8_4_ = auVar75._8_4_ * 3.0;
        auVar132._12_4_ = auVar75._12_4_ * 3.0;
        auVar75 = vsubps_avx(auVar222,auVar187);
        auVar153._0_4_ = auVar75._0_4_ * 3.0;
        auVar153._4_4_ = auVar75._4_4_ * 3.0;
        auVar153._8_4_ = auVar75._8_4_ * 3.0;
        auVar153._12_4_ = auVar75._12_4_ * 3.0;
        auVar75 = vsubps_avx(auVar253,auVar222);
        auVar229._0_4_ = auVar75._0_4_ * 3.0;
        auVar229._4_4_ = auVar75._4_4_ * 3.0;
        auVar229._8_4_ = auVar75._8_4_ * 3.0;
        auVar229._12_4_ = auVar75._12_4_ * 3.0;
        auVar263 = vminps_avx(auVar153,auVar229);
        auVar75 = vmaxps_avx(auVar153,auVar229);
        auVar263 = vminps_avx(auVar132,auVar263);
        auVar75 = vmaxps_avx(auVar132,auVar75);
        auVar143 = vshufpd_avx(auVar263,auVar263,3);
        auVar69 = vshufpd_avx(auVar75,auVar75,3);
        auVar263 = vminps_avx(auVar263,auVar143);
        auVar75 = vmaxps_avx(auVar75,auVar69);
        auVar143 = vshufps_avx(ZEXT416((uint)(1.0 / fVar193)),ZEXT416((uint)(1.0 / fVar193)),0);
        auVar230._0_4_ = auVar143._0_4_ * auVar263._0_4_;
        auVar230._4_4_ = auVar143._4_4_ * auVar263._4_4_;
        auVar230._8_4_ = auVar143._8_4_ * auVar263._8_4_;
        auVar230._12_4_ = auVar143._12_4_ * auVar263._12_4_;
        auVar240._0_4_ = auVar143._0_4_ * auVar75._0_4_;
        auVar240._4_4_ = auVar143._4_4_ * auVar75._4_4_;
        auVar240._8_4_ = auVar143._8_4_ * auVar75._8_4_;
        auVar240._12_4_ = auVar143._12_4_ * auVar75._12_4_;
        auVar68 = ZEXT416((uint)(1.0 / (auVar98._0_4_ - auVar207._0_4_)));
        auVar75 = vshufpd_avx(auVar78,auVar78,3);
        auVar263 = vshufpd_avx(auVar187,auVar187,3);
        auVar143 = vshufpd_avx(auVar222,auVar222,3);
        auVar69 = vshufpd_avx(auVar253,auVar253,3);
        auVar75 = vsubps_avx(auVar75,auVar78);
        auVar104 = vsubps_avx(auVar263,auVar187);
        auVar129 = vsubps_avx(auVar143,auVar222);
        auVar69 = vsubps_avx(auVar69,auVar253);
        auVar263 = vminps_avx(auVar75,auVar104);
        auVar75 = vmaxps_avx(auVar75,auVar104);
        auVar143 = vminps_avx(auVar129,auVar69);
        auVar143 = vminps_avx(auVar263,auVar143);
        auVar263 = vmaxps_avx(auVar129,auVar69);
        auVar75 = vmaxps_avx(auVar75,auVar263);
        auVar263 = vshufps_avx(auVar68,auVar68,0);
        auVar288._0_4_ = auVar263._0_4_ * auVar143._0_4_;
        auVar288._4_4_ = auVar263._4_4_ * auVar143._4_4_;
        auVar288._8_4_ = auVar263._8_4_ * auVar143._8_4_;
        auVar288._12_4_ = auVar263._12_4_ * auVar143._12_4_;
        auVar297._0_4_ = auVar263._0_4_ * auVar75._0_4_;
        auVar297._4_4_ = auVar263._4_4_ * auVar75._4_4_;
        auVar297._8_4_ = auVar263._8_4_ * auVar75._8_4_;
        auVar297._12_4_ = auVar263._12_4_ * auVar75._12_4_;
        auVar75 = vmovsldup_avx(auVar207);
        auVar254._4_12_ = auVar75._4_12_;
        auVar254._0_4_ = fVar157;
        auVar265._4_12_ = auVar207._4_12_;
        auVar265._0_4_ = fVar147;
        auVar154._0_4_ = (fVar157 + fVar147) * 0.5;
        auVar154._4_4_ = (auVar75._4_4_ + auVar207._4_4_) * 0.5;
        auVar154._8_4_ = (auVar75._8_4_ + auVar207._8_4_) * 0.5;
        auVar154._12_4_ = (auVar75._12_4_ + auVar207._12_4_) * 0.5;
        auVar75 = vshufps_avx(auVar154,auVar154,0);
        fVar194 = auVar75._0_4_;
        fVar158 = auVar75._4_4_;
        fVar195 = auVar75._8_4_;
        fVar159 = auVar75._12_4_;
        local_6d0._0_4_ = auVar16._0_4_;
        local_6d0._4_4_ = auVar16._4_4_;
        fStack_6c8 = auVar16._8_4_;
        fStack_6c4 = auVar16._12_4_;
        auVar105._0_4_ = fVar194 * (float)local_350._0_4_ + (float)local_6d0._0_4_;
        auVar105._4_4_ = fVar158 * (float)local_350._4_4_ + (float)local_6d0._4_4_;
        auVar105._8_4_ = fVar195 * fStack_348 + fStack_6c8;
        auVar105._12_4_ = fVar159 * fStack_344 + fStack_6c4;
        local_5b0 = auVar17._0_4_;
        fStack_5ac = auVar17._4_4_;
        fStack_5a8 = auVar17._8_4_;
        fStack_5a4 = auVar17._12_4_;
        auVar133._0_4_ = fVar194 * (float)local_360._0_4_ + local_5b0;
        auVar133._4_4_ = fVar158 * (float)local_360._4_4_ + fStack_5ac;
        auVar133._8_4_ = fVar195 * fStack_358 + fStack_5a8;
        auVar133._12_4_ = fVar159 * fStack_354 + fStack_5a4;
        local_5c0 = auVar18._0_4_;
        fStack_5bc = auVar18._4_4_;
        fStack_5b8 = auVar18._8_4_;
        fStack_5b4 = auVar18._12_4_;
        auVar188._0_4_ = fVar194 * (float)local_370._0_4_ + local_5c0;
        auVar188._4_4_ = fVar158 * (float)local_370._4_4_ + fStack_5bc;
        auVar188._8_4_ = fVar195 * fStack_368 + fStack_5b8;
        auVar188._12_4_ = fVar159 * fStack_364 + fStack_5b4;
        auVar75 = vsubps_avx(auVar133,auVar105);
        auVar106._0_4_ = auVar105._0_4_ + fVar194 * auVar75._0_4_;
        auVar106._4_4_ = auVar105._4_4_ + fVar158 * auVar75._4_4_;
        auVar106._8_4_ = auVar105._8_4_ + fVar195 * auVar75._8_4_;
        auVar106._12_4_ = auVar105._12_4_ + fVar159 * auVar75._12_4_;
        auVar75 = vsubps_avx(auVar188,auVar133);
        auVar134._0_4_ = auVar133._0_4_ + fVar194 * auVar75._0_4_;
        auVar134._4_4_ = auVar133._4_4_ + fVar158 * auVar75._4_4_;
        auVar134._8_4_ = auVar133._8_4_ + fVar195 * auVar75._8_4_;
        auVar134._12_4_ = auVar133._12_4_ + fVar159 * auVar75._12_4_;
        auVar75 = vsubps_avx(auVar134,auVar106);
        fVar194 = auVar106._0_4_ + fVar194 * auVar75._0_4_;
        fVar158 = auVar106._4_4_ + fVar158 * auVar75._4_4_;
        auVar79._0_8_ = CONCAT44(fVar158,fVar194);
        auVar79._8_4_ = auVar106._8_4_ + fVar195 * auVar75._8_4_;
        auVar79._12_4_ = auVar106._12_4_ + fVar159 * auVar75._12_4_;
        fVar195 = auVar75._0_4_ * 3.0;
        fVar159 = auVar75._4_4_ * 3.0;
        auVar107._0_8_ = CONCAT44(fVar159,fVar195);
        auVar107._8_4_ = auVar75._8_4_ * 3.0;
        auVar107._12_4_ = auVar75._12_4_ * 3.0;
        auVar135._8_8_ = auVar79._0_8_;
        auVar135._0_8_ = auVar79._0_8_;
        auVar75 = vshufpd_avx(auVar79,auVar79,3);
        auVar263 = vshufps_avx(auVar154,auVar154,0x55);
        auVar129 = vsubps_avx(auVar75,auVar135);
        auVar275._0_4_ = auVar129._0_4_ * auVar263._0_4_ + fVar194;
        auVar275._4_4_ = auVar129._4_4_ * auVar263._4_4_ + fVar158;
        auVar275._8_4_ = auVar129._8_4_ * auVar263._8_4_ + fVar194;
        auVar275._12_4_ = auVar129._12_4_ * auVar263._12_4_ + fVar158;
        auVar136._8_8_ = auVar107._0_8_;
        auVar136._0_8_ = auVar107._0_8_;
        auVar75 = vshufpd_avx(auVar107,auVar107,1);
        auVar75 = vsubps_avx(auVar75,auVar136);
        auVar108._0_4_ = auVar75._0_4_ * auVar263._0_4_ + fVar195;
        auVar108._4_4_ = auVar75._4_4_ * auVar263._4_4_ + fVar159;
        auVar108._8_4_ = auVar75._8_4_ * auVar263._8_4_ + fVar195;
        auVar108._12_4_ = auVar75._12_4_ * auVar263._12_4_ + fVar159;
        auVar263 = vmovshdup_avx(auVar108);
        auVar189._0_8_ = auVar263._0_8_ ^ 0x8000000080000000;
        auVar189._8_4_ = auVar263._8_4_ ^ 0x80000000;
        auVar189._12_4_ = auVar263._12_4_ ^ 0x80000000;
        auVar143 = vmovshdup_avx(auVar129);
        auVar75 = vunpcklps_avx(auVar143,auVar189);
        auVar69 = vshufps_avx(auVar75,auVar189,4);
        auVar80._0_8_ = auVar129._0_8_ ^ 0x8000000080000000;
        auVar80._8_4_ = -auVar129._8_4_;
        auVar80._12_4_ = -auVar129._12_4_;
        auVar75 = vmovlhps_avx(auVar80,auVar108);
        auVar104 = vshufps_avx(auVar75,auVar108,8);
        auVar75 = ZEXT416((uint)(auVar108._0_4_ * auVar143._0_4_ - auVar129._0_4_ * auVar263._0_4_))
        ;
        auVar263 = vshufps_avx(auVar75,auVar75,0);
        auVar75 = vdivps_avx(auVar69,auVar263);
        auVar263 = vdivps_avx(auVar104,auVar263);
        auVar104 = vinsertps_avx(auVar230,auVar288,0x1c);
        auVar129 = vinsertps_avx(auVar240,auVar297,0x1c);
        auVar68 = vinsertps_avx(auVar288,auVar230,0x4c);
        auVar99 = vinsertps_avx(auVar297,auVar240,0x4c);
        auVar143 = vmovsldup_avx(auVar75);
        auVar137._0_4_ = auVar143._0_4_ * auVar104._0_4_;
        auVar137._4_4_ = auVar143._4_4_ * auVar104._4_4_;
        auVar137._8_4_ = auVar143._8_4_ * auVar104._8_4_;
        auVar137._12_4_ = auVar143._12_4_ * auVar104._12_4_;
        auVar109._0_4_ = auVar129._0_4_ * auVar143._0_4_;
        auVar109._4_4_ = auVar129._4_4_ * auVar143._4_4_;
        auVar109._8_4_ = auVar129._8_4_ * auVar143._8_4_;
        auVar109._12_4_ = auVar129._12_4_ * auVar143._12_4_;
        auVar69 = vminps_avx(auVar137,auVar109);
        auVar143 = vmaxps_avx(auVar109,auVar137);
        auVar121 = vmovsldup_avx(auVar263);
        auVar298._0_4_ = auVar68._0_4_ * auVar121._0_4_;
        auVar298._4_4_ = auVar68._4_4_ * auVar121._4_4_;
        auVar298._8_4_ = auVar68._8_4_ * auVar121._8_4_;
        auVar298._12_4_ = auVar68._12_4_ * auVar121._12_4_;
        auVar138._0_4_ = auVar99._0_4_ * auVar121._0_4_;
        auVar138._4_4_ = auVar99._4_4_ * auVar121._4_4_;
        auVar138._8_4_ = auVar99._8_4_ * auVar121._8_4_;
        auVar138._12_4_ = auVar99._12_4_ * auVar121._12_4_;
        auVar121 = vminps_avx(auVar298,auVar138);
        auVar169._0_4_ = auVar69._0_4_ + auVar121._0_4_;
        auVar169._4_4_ = auVar69._4_4_ + auVar121._4_4_;
        auVar169._8_4_ = auVar69._8_4_ + auVar121._8_4_;
        auVar169._12_4_ = auVar69._12_4_ + auVar121._12_4_;
        auVar69 = vmaxps_avx(auVar138,auVar298);
        auVar121 = vsubps_avx(auVar254,auVar154);
        auVar122 = vsubps_avx(auVar265,auVar154);
        auVar110._0_4_ = auVar143._0_4_ + auVar69._0_4_;
        auVar110._4_4_ = auVar143._4_4_ + auVar69._4_4_;
        auVar110._8_4_ = auVar143._8_4_ + auVar69._8_4_;
        auVar110._12_4_ = auVar143._12_4_ + auVar69._12_4_;
        auVar139._8_8_ = 0x3f800000;
        auVar139._0_8_ = 0x3f800000;
        auVar143 = vsubps_avx(auVar139,auVar110);
        auVar69 = vsubps_avx(auVar139,auVar169);
        fVar211 = auVar121._0_4_;
        auVar170._0_4_ = fVar211 * auVar143._0_4_;
        fVar212 = auVar121._4_4_;
        auVar170._4_4_ = fVar212 * auVar143._4_4_;
        fVar260 = auVar121._8_4_;
        auVar170._8_4_ = fVar260 * auVar143._8_4_;
        fVar269 = auVar121._12_4_;
        auVar170._12_4_ = fVar269 * auVar143._12_4_;
        fVar195 = auVar122._0_4_;
        auVar111._0_4_ = fVar195 * auVar143._0_4_;
        fVar159 = auVar122._4_4_;
        auVar111._4_4_ = fVar159 * auVar143._4_4_;
        fVar196 = auVar122._8_4_;
        auVar111._8_4_ = fVar196 * auVar143._8_4_;
        fVar210 = auVar122._12_4_;
        auVar111._12_4_ = fVar210 * auVar143._12_4_;
        auVar266._0_4_ = fVar211 * auVar69._0_4_;
        auVar266._4_4_ = fVar212 * auVar69._4_4_;
        auVar266._8_4_ = fVar260 * auVar69._8_4_;
        auVar266._12_4_ = fVar269 * auVar69._12_4_;
        auVar140._0_4_ = fVar195 * auVar69._0_4_;
        auVar140._4_4_ = fVar159 * auVar69._4_4_;
        auVar140._8_4_ = fVar196 * auVar69._8_4_;
        auVar140._12_4_ = fVar210 * auVar69._12_4_;
        auVar143 = vminps_avx(auVar170,auVar266);
        auVar69 = vminps_avx(auVar111,auVar140);
        auVar121 = vminps_avx(auVar143,auVar69);
        auVar143 = vmaxps_avx(auVar266,auVar170);
        auVar69 = vmaxps_avx(auVar140,auVar111);
        auVar122 = vshufps_avx(auVar154,auVar154,0x54);
        auVar69 = vmaxps_avx(auVar69,auVar143);
        auVar123 = vshufps_avx(auVar275,auVar275,0);
        auVar148 = vshufps_avx(auVar275,auVar275,0x55);
        auVar143 = vhaddps_avx(auVar121,auVar121);
        auVar69 = vhaddps_avx(auVar69,auVar69);
        auVar155._0_4_ = auVar123._0_4_ * auVar75._0_4_ + auVar148._0_4_ * auVar263._0_4_;
        auVar155._4_4_ = auVar123._4_4_ * auVar75._4_4_ + auVar148._4_4_ * auVar263._4_4_;
        auVar155._8_4_ = auVar123._8_4_ * auVar75._8_4_ + auVar148._8_4_ * auVar263._8_4_;
        auVar155._12_4_ = auVar123._12_4_ * auVar75._12_4_ + auVar148._12_4_ * auVar263._12_4_;
        auVar121 = vsubps_avx(auVar122,auVar155);
        fVar194 = auVar121._0_4_ + auVar143._0_4_;
        fVar158 = auVar121._0_4_ + auVar69._0_4_;
        auVar143 = vmaxss_avx(ZEXT416((uint)fVar157),ZEXT416((uint)fVar194));
        auVar69 = vminss_avx(ZEXT416((uint)fVar158),ZEXT416((uint)fVar147));
      } while (auVar69._0_4_ < auVar143._0_4_);
      auVar143 = vmovshdup_avx(auVar75);
      auVar81._0_4_ = auVar143._0_4_ * auVar104._0_4_;
      auVar81._4_4_ = auVar143._4_4_ * auVar104._4_4_;
      auVar81._8_4_ = auVar143._8_4_ * auVar104._8_4_;
      auVar81._12_4_ = auVar143._12_4_ * auVar104._12_4_;
      auVar112._0_4_ = auVar129._0_4_ * auVar143._0_4_;
      auVar112._4_4_ = auVar129._4_4_ * auVar143._4_4_;
      auVar112._8_4_ = auVar129._8_4_ * auVar143._8_4_;
      auVar112._12_4_ = auVar129._12_4_ * auVar143._12_4_;
      auVar69 = vminps_avx(auVar81,auVar112);
      auVar143 = vmaxps_avx(auVar112,auVar81);
      auVar104 = vmovshdup_avx(auVar263);
      auVar171._0_4_ = auVar68._0_4_ * auVar104._0_4_;
      auVar171._4_4_ = auVar68._4_4_ * auVar104._4_4_;
      auVar171._8_4_ = auVar68._8_4_ * auVar104._8_4_;
      auVar171._12_4_ = auVar68._12_4_ * auVar104._12_4_;
      auVar113._0_4_ = auVar99._0_4_ * auVar104._0_4_;
      auVar113._4_4_ = auVar99._4_4_ * auVar104._4_4_;
      auVar113._8_4_ = auVar99._8_4_ * auVar104._8_4_;
      auVar113._12_4_ = auVar99._12_4_ * auVar104._12_4_;
      auVar104 = vminps_avx(auVar171,auVar113);
      auVar141._0_4_ = auVar69._0_4_ + auVar104._0_4_;
      auVar141._4_4_ = auVar69._4_4_ + auVar104._4_4_;
      auVar141._8_4_ = auVar69._8_4_ + auVar104._8_4_;
      auVar141._12_4_ = auVar69._12_4_ + auVar104._12_4_;
      auVar69 = vmaxps_avx(auVar113,auVar171);
      auVar82._0_4_ = auVar143._0_4_ + auVar69._0_4_;
      auVar82._4_4_ = auVar143._4_4_ + auVar69._4_4_;
      auVar82._8_4_ = auVar143._8_4_ + auVar69._8_4_;
      auVar82._12_4_ = auVar143._12_4_ + auVar69._12_4_;
      auVar143 = vsubps_avx(auVar205,auVar82);
      auVar69 = vsubps_avx(auVar205,auVar141);
      auVar142._0_4_ = fVar211 * auVar143._0_4_;
      auVar142._4_4_ = fVar212 * auVar143._4_4_;
      auVar142._8_4_ = fVar260 * auVar143._8_4_;
      auVar142._12_4_ = fVar269 * auVar143._12_4_;
      auVar172._0_4_ = fVar211 * auVar69._0_4_;
      auVar172._4_4_ = fVar212 * auVar69._4_4_;
      auVar172._8_4_ = fVar260 * auVar69._8_4_;
      auVar172._12_4_ = fVar269 * auVar69._12_4_;
      auVar83._0_4_ = fVar195 * auVar143._0_4_;
      auVar83._4_4_ = fVar159 * auVar143._4_4_;
      auVar83._8_4_ = fVar196 * auVar143._8_4_;
      auVar83._12_4_ = fVar210 * auVar143._12_4_;
      auVar114._0_4_ = fVar195 * auVar69._0_4_;
      auVar114._4_4_ = fVar159 * auVar69._4_4_;
      auVar114._8_4_ = fVar196 * auVar69._8_4_;
      auVar114._12_4_ = fVar210 * auVar69._12_4_;
      auVar143 = vminps_avx(auVar142,auVar172);
      auVar69 = vminps_avx(auVar83,auVar114);
      auVar143 = vminps_avx(auVar143,auVar69);
      auVar69 = vmaxps_avx(auVar172,auVar142);
      auVar104 = vmaxps_avx(auVar114,auVar83);
      auVar143 = vhaddps_avx(auVar143,auVar143);
      auVar69 = vmaxps_avx(auVar104,auVar69);
      auVar69 = vhaddps_avx(auVar69,auVar69);
      auVar104 = vmovshdup_avx(auVar121);
      auVar129 = ZEXT416((uint)(auVar104._0_4_ + auVar143._0_4_));
      auVar143 = vmaxss_avx(auVar207,auVar129);
      auVar104 = ZEXT416((uint)(auVar104._0_4_ + auVar69._0_4_));
      auVar69 = vminss_avx(auVar104,auVar98);
    } while (auVar69._0_4_ < auVar143._0_4_);
    uVar60 = 0;
    if ((fVar157 < fVar194) && (fVar158 < fVar147)) {
      auVar143 = vcmpps_avx(auVar104,auVar98,1);
      auVar69 = vcmpps_avx(auVar207,auVar129,1);
      auVar143 = vandps_avx(auVar69,auVar143);
      uVar60 = auVar143._0_4_;
    }
    auVar231._8_4_ = 0x7fffffff;
    auVar231._0_8_ = 0x7fffffff7fffffff;
    auVar231._12_4_ = 0x7fffffff;
    if ((3 < (uint)uVar65 || fVar193 < 0.001) || (uVar60 & 1) != 0) {
      lVar61 = 0xc9;
      do {
        lVar61 = lVar61 + -1;
        if (lVar61 == 0) goto LAB_007a4c98;
        fVar193 = auVar121._0_4_;
        fVar147 = 1.0 - fVar193;
        auVar143 = ZEXT416((uint)(fVar147 * fVar147 * fVar147));
        auVar143 = vshufps_avx(auVar143,auVar143,0);
        auVar69 = ZEXT416((uint)(fVar193 * 3.0 * fVar147 * fVar147));
        auVar69 = vshufps_avx(auVar69,auVar69,0);
        auVar104 = ZEXT416((uint)(fVar147 * fVar193 * fVar193 * 3.0));
        auVar104 = vshufps_avx(auVar104,auVar104,0);
        auVar129 = ZEXT416((uint)(fVar193 * fVar193 * fVar193));
        auVar129 = vshufps_avx(auVar129,auVar129,0);
        fVar147 = (float)local_6d0._0_4_ * auVar143._0_4_ +
                  local_5b0 * auVar69._0_4_ +
                  (float)local_380._0_4_ * auVar129._0_4_ + local_5c0 * auVar104._0_4_;
        fVar193 = (float)local_6d0._4_4_ * auVar143._4_4_ +
                  fStack_5ac * auVar69._4_4_ +
                  (float)local_380._4_4_ * auVar129._4_4_ + fStack_5bc * auVar104._4_4_;
        auVar84._0_8_ = CONCAT44(fVar193,fVar147);
        auVar84._8_4_ =
             fStack_6c8 * auVar143._8_4_ +
             fStack_5a8 * auVar69._8_4_ + fStack_378 * auVar129._8_4_ + fStack_5b8 * auVar104._8_4_;
        auVar84._12_4_ =
             fStack_6c4 * auVar143._12_4_ +
             fStack_5a4 * auVar69._12_4_ +
             fStack_374 * auVar129._12_4_ + fStack_5b4 * auVar104._12_4_;
        auVar115._8_8_ = auVar84._0_8_;
        auVar115._0_8_ = auVar84._0_8_;
        auVar69 = vshufpd_avx(auVar84,auVar84,1);
        auVar143 = vmovshdup_avx(auVar121);
        auVar69 = vsubps_avx(auVar69,auVar115);
        auVar85._0_4_ = auVar143._0_4_ * auVar69._0_4_ + fVar147;
        auVar85._4_4_ = auVar143._4_4_ * auVar69._4_4_ + fVar193;
        auVar85._8_4_ = auVar143._8_4_ * auVar69._8_4_ + fVar147;
        auVar85._12_4_ = auVar143._12_4_ * auVar69._12_4_ + fVar193;
        auVar143 = vshufps_avx(auVar85,auVar85,0);
        auVar69 = vshufps_avx(auVar85,auVar85,0x55);
        auVar116._0_4_ = auVar75._0_4_ * auVar143._0_4_ + auVar263._0_4_ * auVar69._0_4_;
        auVar116._4_4_ = auVar75._4_4_ * auVar143._4_4_ + auVar263._4_4_ * auVar69._4_4_;
        auVar116._8_4_ = auVar75._8_4_ * auVar143._8_4_ + auVar263._8_4_ * auVar69._8_4_;
        auVar116._12_4_ = auVar75._12_4_ * auVar143._12_4_ + auVar263._12_4_ * auVar69._12_4_;
        auVar121 = vsubps_avx(auVar121,auVar116);
        auVar143 = vandps_avx(auVar231,auVar85);
        auVar69 = vshufps_avx(auVar143,auVar143,0xf5);
        auVar143 = vmaxss_avx(auVar69,auVar143);
      } while ((float)local_390._0_4_ <= auVar143._0_4_);
      fVar147 = auVar121._0_4_;
      if ((0.0 <= fVar147) && (fVar147 <= 1.0)) {
        auVar75 = vmovshdup_avx(auVar121);
        fVar193 = auVar75._0_4_;
        if ((0.0 <= fVar193) && (fVar193 <= 1.0)) {
          auVar75 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                  ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
          auVar99 = vinsertps_avx(auVar75,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
          auVar75 = vdpps_avx(auVar99,local_3a0,0x7f);
          auVar263 = vdpps_avx(auVar99,local_3b0,0x7f);
          auVar143 = vdpps_avx(auVar99,local_3c0,0x7f);
          auVar69 = vdpps_avx(auVar99,local_3d0,0x7f);
          auVar104 = vdpps_avx(auVar99,local_3e0,0x7f);
          auVar129 = vdpps_avx(auVar99,local_3f0,0x7f);
          auVar68 = vdpps_avx(auVar99,local_400,0x7f);
          auVar99 = vdpps_avx(auVar99,local_410,0x7f);
          fVar159 = 1.0 - fVar193;
          fVar196 = 1.0 - fVar147;
          fVar157 = auVar121._4_4_;
          fVar194 = auVar121._8_4_;
          fVar158 = auVar121._12_4_;
          fVar195 = fVar196 * fVar147 * fVar147 * 3.0;
          auVar223._0_4_ = fVar147 * fVar147 * fVar147;
          auVar223._4_4_ = fVar157 * fVar157 * fVar157;
          auVar223._8_4_ = fVar194 * fVar194 * fVar194;
          auVar223._12_4_ = fVar158 * fVar158 * fVar158;
          fVar194 = fVar196 * fVar196 * fVar147 * 3.0;
          fVar158 = fVar196 * fVar196 * fVar196;
          fVar157 = fVar158 * (fVar159 * auVar75._0_4_ + fVar193 * auVar104._0_4_) +
                    (fVar159 * auVar263._0_4_ + auVar129._0_4_ * fVar193) * fVar194 +
                    fVar195 * (auVar68._0_4_ * fVar193 + fVar159 * auVar143._0_4_) +
                    auVar223._0_4_ * (fVar159 * auVar69._0_4_ + fVar193 * auVar99._0_4_);
          if (((fVar177 <= fVar157) &&
              (fVar159 = *(float *)(ray + k * 4 + 0x100), fVar157 <= fVar159)) &&
             (pGVar11 = (context->scene->geometries).items[uVar59].ptr,
             (pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) != 0)) {
            auStack_f0 = vshufps_avx(auVar121,auVar121,0x55);
            auVar241._8_4_ = 0x3f800000;
            auVar241._0_8_ = 0x3f8000003f800000;
            auVar241._12_4_ = 0x3f800000;
            auVar75 = vsubps_avx(auVar241,auStack_f0);
            fVar210 = auStack_f0._0_4_;
            fVar211 = auStack_f0._4_4_;
            fVar212 = auStack_f0._8_4_;
            fVar260 = auStack_f0._12_4_;
            fVar269 = auVar75._0_4_;
            fVar270 = auVar75._4_4_;
            fVar271 = auVar75._8_4_;
            fVar272 = auVar75._12_4_;
            auVar255._0_4_ = fVar210 * (float)local_4b0._0_4_ + fVar269 * (float)local_4a0._0_4_;
            auVar255._4_4_ = fVar211 * (float)local_4b0._4_4_ + fVar270 * (float)local_4a0._4_4_;
            auVar255._8_4_ = fVar212 * fStack_4a8 + fVar271 * fStack_498;
            auVar255._12_4_ = fVar260 * fStack_4a4 + fVar272 * fStack_494;
            auVar267._0_4_ = fVar210 * (float)local_4f0._0_4_ + fVar269 * (float)local_4d0._0_4_;
            auVar267._4_4_ = fVar211 * (float)local_4f0._4_4_ + fVar270 * (float)local_4d0._4_4_;
            auVar267._8_4_ = fVar212 * fStack_4e8 + fVar271 * fStack_4c8;
            auVar267._12_4_ = fVar260 * fStack_4e4 + fVar272 * fStack_4c4;
            auVar276._0_4_ = fVar210 * (float)local_430._0_4_ + fVar269 * (float)local_4e0._0_4_;
            auVar276._4_4_ = fVar211 * (float)local_430._4_4_ + fVar270 * (float)local_4e0._4_4_;
            auVar276._8_4_ = fVar212 * fStack_428 + fVar271 * fStack_4d8;
            auVar276._12_4_ = fVar260 * fStack_424 + fVar272 * fStack_4d4;
            auVar242._0_4_ = fVar210 * fVar67 + fVar269 * (float)local_4c0._0_4_;
            auVar242._4_4_ = fVar211 * fVar95 + fVar270 * (float)local_4c0._4_4_;
            auVar242._8_4_ = fVar212 * fVar96 + fVar271 * fStack_4b8;
            auVar242._12_4_ = fVar260 * fVar97 + fVar272 * fStack_4b4;
            auVar69 = vsubps_avx(auVar267,auVar255);
            auVar104 = vsubps_avx(auVar276,auVar267);
            auVar129 = vsubps_avx(auVar242,auVar276);
            auStack_110 = vshufps_avx(auVar121,auVar121,0);
            fVar260 = auStack_110._0_4_;
            fVar269 = auStack_110._4_4_;
            fVar270 = auStack_110._8_4_;
            fVar271 = auStack_110._12_4_;
            auVar75 = vshufps_avx(ZEXT416((uint)fVar196),ZEXT416((uint)fVar196),0);
            fVar196 = auVar75._0_4_;
            fVar210 = auVar75._4_4_;
            fVar211 = auVar75._8_4_;
            fVar212 = auVar75._12_4_;
            auVar75 = vshufps_avx(auVar223,auVar223,0);
            auVar263 = vshufps_avx(ZEXT416((uint)fVar195),ZEXT416((uint)fVar195),0);
            auVar143 = vshufps_avx(ZEXT416((uint)fVar194),ZEXT416((uint)fVar194),0);
            auVar208._0_4_ =
                 (fVar196 * (fVar196 * auVar69._0_4_ + fVar260 * auVar104._0_4_) +
                 fVar260 * (fVar196 * auVar104._0_4_ + fVar260 * auVar129._0_4_)) * 3.0;
            auVar208._4_4_ =
                 (fVar210 * (fVar210 * auVar69._4_4_ + fVar269 * auVar104._4_4_) +
                 fVar269 * (fVar210 * auVar104._4_4_ + fVar269 * auVar129._4_4_)) * 3.0;
            auVar208._8_4_ =
                 (fVar211 * (fVar211 * auVar69._8_4_ + fVar270 * auVar104._8_4_) +
                 fVar270 * (fVar211 * auVar104._8_4_ + fVar270 * auVar129._8_4_)) * 3.0;
            auVar208._12_4_ =
                 (fVar212 * (fVar212 * auVar69._12_4_ + fVar271 * auVar104._12_4_) +
                 fVar271 * (fVar212 * auVar104._12_4_ + fVar271 * auVar129._12_4_)) * 3.0;
            auVar69 = vshufps_avx(ZEXT416((uint)fVar158),ZEXT416((uint)fVar158),0);
            auVar173._0_4_ =
                 auVar69._0_4_ * (float)local_440._0_4_ +
                 auVar143._0_4_ * (float)local_450._0_4_ +
                 auVar75._0_4_ * (float)local_470._0_4_ + auVar263._0_4_ * (float)local_460._0_4_;
            auVar173._4_4_ =
                 auVar69._4_4_ * (float)local_440._4_4_ +
                 auVar143._4_4_ * (float)local_450._4_4_ +
                 auVar75._4_4_ * (float)local_470._4_4_ + auVar263._4_4_ * (float)local_460._4_4_;
            auVar173._8_4_ =
                 auVar69._8_4_ * fStack_438 +
                 auVar143._8_4_ * fStack_448 +
                 auVar75._8_4_ * fStack_468 + auVar263._8_4_ * fStack_458;
            auVar173._12_4_ =
                 auVar69._12_4_ * fStack_434 +
                 auVar143._12_4_ * fStack_444 +
                 auVar75._12_4_ * fStack_464 + auVar263._12_4_ * fStack_454;
            auVar75 = vshufps_avx(auVar208,auVar208,0xc9);
            auVar190._0_4_ = auVar173._0_4_ * auVar75._0_4_;
            auVar190._4_4_ = auVar173._4_4_ * auVar75._4_4_;
            auVar190._8_4_ = auVar173._8_4_ * auVar75._8_4_;
            auVar190._12_4_ = auVar173._12_4_ * auVar75._12_4_;
            auVar75 = vshufps_avx(auVar173,auVar173,0xc9);
            auVar174._0_4_ = auVar208._0_4_ * auVar75._0_4_;
            auVar174._4_4_ = auVar208._4_4_ * auVar75._4_4_;
            auVar174._8_4_ = auVar208._8_4_ * auVar75._8_4_;
            auVar174._12_4_ = auVar208._12_4_ * auVar75._12_4_;
            auVar75 = vsubps_avx(auVar174,auVar190);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
              auStack_170 = vshufps_avx(auVar75,auVar75,0x55);
              auStack_150 = vshufps_avx(auVar75,auVar75,0xaa);
              auStack_130 = vshufps_avx(auVar75,auVar75,0);
              local_180[0] = (RTCHitN)auStack_170[0];
              local_180[1] = (RTCHitN)auStack_170[1];
              local_180[2] = (RTCHitN)auStack_170[2];
              local_180[3] = (RTCHitN)auStack_170[3];
              local_180[4] = (RTCHitN)auStack_170[4];
              local_180[5] = (RTCHitN)auStack_170[5];
              local_180[6] = (RTCHitN)auStack_170[6];
              local_180[7] = (RTCHitN)auStack_170[7];
              local_180[8] = (RTCHitN)auStack_170[8];
              local_180[9] = (RTCHitN)auStack_170[9];
              local_180[10] = (RTCHitN)auStack_170[10];
              local_180[0xb] = (RTCHitN)auStack_170[0xb];
              local_180[0xc] = (RTCHitN)auStack_170[0xc];
              local_180[0xd] = (RTCHitN)auStack_170[0xd];
              local_180[0xe] = (RTCHitN)auStack_170[0xe];
              local_180[0xf] = (RTCHitN)auStack_170[0xf];
              local_160 = auStack_150;
              local_140 = auStack_130;
              local_120 = auStack_110;
              local_100 = auStack_f0;
              local_e0 = local_320._0_8_;
              uStack_d8 = local_320._8_8_;
              uStack_d0 = local_320._16_8_;
              uStack_c8 = local_320._24_8_;
              local_c0 = local_300;
              vcmpps_avx(local_300,local_300,0xf);
              uStack_9c = context->user->instID[0];
              local_a0 = uStack_9c;
              uStack_98 = uStack_9c;
              uStack_94 = uStack_9c;
              uStack_90 = uStack_9c;
              uStack_8c = uStack_9c;
              uStack_88 = uStack_9c;
              uStack_84 = uStack_9c;
              uStack_7c = context->user->instPrimID[0];
              local_80 = uStack_7c;
              uStack_78 = uStack_7c;
              uStack_74 = uStack_7c;
              uStack_70 = uStack_7c;
              uStack_6c = uStack_7c;
              uStack_68 = uStack_7c;
              uStack_64 = uStack_7c;
              *(float *)(ray + k * 4 + 0x100) = fVar157;
              local_580 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar64 & 0xf) << 4));
              local_570 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar64 >> 4) * 0x10)
              ;
              local_550.valid = (int *)local_580;
              local_550.geometryUserPtr = pGVar11->userPtr;
              local_550.context = context->user;
              local_550.hit = local_180;
              local_550.N = 8;
              local_550.ray = (RTCRayN *)ray;
              if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar11->intersectionFilterN)(&local_550);
              }
              auVar75 = vpcmpeqd_avx(local_580,ZEXT816(0) << 0x40);
              auVar263 = vpcmpeqd_avx(local_570,ZEXT816(0) << 0x40);
              auVar146._16_16_ = auVar263;
              auVar146._0_16_ = auVar75;
              auVar87 = _DAT_01f7b020 & ~auVar146;
              if ((((((((auVar87 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar87 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar87 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar87 >> 0x7f,0) != '\0') ||
                    (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar87 >> 0xbf,0) != '\0') ||
                  (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar87[0x1f] < '\0') {
                p_Var12 = context->args->filter;
                if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*p_Var12)(&local_550);
                }
                auVar75 = vpcmpeqd_avx(local_580,ZEXT816(0) << 0x40);
                auVar263 = vpcmpeqd_avx(local_570,ZEXT816(0) << 0x40);
                auVar93._16_16_ = auVar263;
                auVar93._0_16_ = auVar75;
                auVar87 = _DAT_01f7b020 & ~auVar93;
                if ((((((((auVar87 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar87 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar87 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar87 >> 0x7f,0) != '\0') ||
                      (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar87 >> 0xbf,0) != '\0') ||
                    (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar87[0x1f] < '\0') {
                  auVar94._0_8_ = auVar75._0_8_ ^ 0xffffffffffffffff;
                  auVar94._8_4_ = auVar75._8_4_ ^ 0xffffffff;
                  auVar94._12_4_ = auVar75._12_4_ ^ 0xffffffff;
                  auVar94._16_4_ = auVar263._0_4_ ^ 0xffffffff;
                  auVar94._20_4_ = auVar263._4_4_ ^ 0xffffffff;
                  auVar94._24_4_ = auVar263._8_4_ ^ 0xffffffff;
                  auVar94._28_4_ = auVar263._12_4_ ^ 0xffffffff;
                  auVar87 = vmaskmovps_avx(auVar94,*(undefined1 (*) [32])local_550.hit);
                  *(undefined1 (*) [32])(local_550.ray + 0x180) = auVar87;
                  auVar87 = vmaskmovps_avx(auVar94,*(undefined1 (*) [32])(local_550.hit + 0x20));
                  *(undefined1 (*) [32])(local_550.ray + 0x1a0) = auVar87;
                  auVar87 = vmaskmovps_avx(auVar94,*(undefined1 (*) [32])(local_550.hit + 0x40));
                  *(undefined1 (*) [32])(local_550.ray + 0x1c0) = auVar87;
                  auVar87 = vmaskmovps_avx(auVar94,*(undefined1 (*) [32])(local_550.hit + 0x60));
                  *(undefined1 (*) [32])(local_550.ray + 0x1e0) = auVar87;
                  auVar87 = vmaskmovps_avx(auVar94,*(undefined1 (*) [32])(local_550.hit + 0x80));
                  *(undefined1 (*) [32])(local_550.ray + 0x200) = auVar87;
                  auVar87 = vmaskmovps_avx(auVar94,*(undefined1 (*) [32])(local_550.hit + 0xa0));
                  *(undefined1 (*) [32])(local_550.ray + 0x220) = auVar87;
                  auVar87 = vmaskmovps_avx(auVar94,*(undefined1 (*) [32])(local_550.hit + 0xc0));
                  *(undefined1 (*) [32])(local_550.ray + 0x240) = auVar87;
                  auVar87 = vmaskmovps_avx(auVar94,*(undefined1 (*) [32])(local_550.hit + 0xe0));
                  *(undefined1 (*) [32])(local_550.ray + 0x260) = auVar87;
                  auVar87 = vmaskmovps_avx(auVar94,*(undefined1 (*) [32])(local_550.hit + 0x100));
                  *(undefined1 (*) [32])(local_550.ray + 0x280) = auVar87;
                  goto LAB_007a4c98;
                }
              }
              *(float *)(ray + k * 4 + 0x100) = fVar159;
              goto LAB_007a4c98;
            }
            *(float *)(ray + k * 4 + 0x100) = fVar157;
            uVar6 = vextractps_avx(auVar75,1);
            *(undefined4 *)(ray + k * 4 + 0x180) = uVar6;
            uVar6 = vextractps_avx(auVar75,2);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar6;
            *(int *)(ray + k * 4 + 0x1c0) = auVar75._0_4_;
            *(float *)(ray + k * 4 + 0x1e0) = fVar147;
            *(float *)(ray + k * 4 + 0x200) = fVar193;
            *(uint *)(ray + k * 4 + 0x220) = uVar10;
            *(uint *)(ray + k * 4 + 0x240) = uVar59;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
          }
        }
      }
      goto LAB_007a4c98;
    }
    auVar75 = vinsertps_avx(ZEXT416((uint)fVar157),ZEXT416((uint)fVar147),0x10);
    auVar306 = ZEXT1664(auVar75);
    auVar300 = ZEXT1664(auVar207);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }